

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

void embree::sse42::InstanceArrayIntersectorKMB<4>::intersect
               (vbool<4> *valid_i,Precalculations *pre,RayHitK<4> *ray,RayQueryContext *context,
               Primitive_conflict4 *prim)

{
  RayHitK<4> *pRVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  long lVar6;
  undefined1 auVar7 [12];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 *paVar8;
  _func_int *p_Var9;
  uint uVar10;
  long *plVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar40;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ulong uVar42;
  undefined1 auVar27 [16];
  uint uVar39;
  uint uVar43;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint uVar44;
  undefined1 auVar36 [16];
  uint uVar41;
  uint uVar45;
  undefined1 auVar37 [16];
  undefined1 auVar48 [12];
  float fVar46;
  undefined4 uVar47;
  float fVar78;
  vfloat4 v_8;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar82;
  float fVar103;
  float fVar104;
  vfloat4 v_7;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar105;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar106;
  float fVar107;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar155;
  float fVar170;
  float fVar172;
  undefined1 in_XMM4 [16];
  vfloat4 v_9;
  undefined1 auVar157 [16];
  float fVar156;
  float fVar171;
  float fVar173;
  float fVar175;
  float fVar176;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar178;
  float fVar188;
  float fVar189;
  undefined1 in_XMM5 [16];
  float fVar190;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar191;
  float fVar192;
  float fVar197;
  float fVar198;
  undefined1 in_XMM6 [16];
  undefined1 auVar193 [16];
  float fVar199;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar200;
  float fVar213;
  float fVar214;
  undefined1 in_XMM7 [16];
  vfloat4 v_19;
  float fVar215;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 in_XMM8 [16];
  vfloat4 v_1;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [12];
  float fVar227;
  float fVar228;
  float fVar239;
  undefined1 in_XMM9 [16];
  vfloat4 v_5;
  undefined1 auVar230 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar246 [12];
  float fVar245;
  float fVar255;
  vfloat4 v_12;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar256;
  float fVar257;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar258 [12];
  float fVar268;
  float fVar269;
  undefined1 in_XMM11 [16];
  vfloat4 v_3;
  undefined1 auVar259 [12];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar270;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar286;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar287;
  float fVar292;
  float fVar293;
  undefined1 in_XMM13 [16];
  vfloat4 v_2;
  float fVar294;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar295;
  float fVar296;
  float fVar307;
  float fVar309;
  undefined1 in_XMM14 [16];
  vfloat4 v;
  float fVar311;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar308;
  float fVar310;
  float fVar312;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar321;
  float fVar324;
  undefined1 in_XMM15 [16];
  vfloat4 v_15;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  vfloat4 v_4;
  RayQueryContext newcontext;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  undefined1 local_278 [8];
  undefined8 uStack_270;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined1 local_228 [8];
  undefined8 uStack_220;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [12];
  int iStack_4c;
  RTCIntersectArguments *local_48;
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  int iVar38;
  int iVar174;
  int iVar177;
  
  v_15.field_0._0_12_ = in_XMM15._0_12_;
  v_1.field_0._0_12_ = in_XMM8._0_12_;
  v_3.field_0._0_12_ = in_XMM11._0_12_;
  v_9.field_0._0_12_ = in_XMM4._0_12_;
  paVar8 = &valid_i->field_0;
  uVar14 = prim->primID_;
  uVar39 = prim->instID_;
  pGVar4 = (context->scene->geometries).items[uVar39].ptr;
  p_Var9 = *(_func_int **)&pGVar4->field_0x58;
  if (p_Var9 == (_func_int *)0x0) {
    uVar15 = (ulong)*(uint *)(*(long *)&pGVar4[1].time_range.upper +
                             (long)pGVar4[1].intersectionFilterN * (ulong)uVar14);
    if (uVar15 == 0xffffffff) {
      return;
    }
    valid_i = (vbool<4> *)pGVar4[1].super_RefCount._vptr_RefCount;
    p_Var9 = *(_func_int **)((long)&valid_i->field_0 + uVar15 * 8);
    if (p_Var9 == (_func_int *)0x0) {
      return;
    }
  }
  uVar10 = pGVar4->mask;
  auVar247._0_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x90)) == 0);
  auVar247._4_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x94)) == 0);
  auVar247._8_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x98)) == 0);
  auVar247._12_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x9c)) == 0);
  local_38 = ~auVar247 & (undefined1  [16])*paVar8;
  auVar246 = local_38._0_12_;
  uVar10 = movmskps((int)valid_i,local_38);
  if ((uVar10 != 0) && (pRVar5 = context->user, pRVar5->instID[0] == 0xffffffff)) {
    pRVar5->instID[0] = uVar39;
    pRVar5->instPrimID[0] = uVar14;
    uVar15 = (ulong)prim->primID_;
    auVar247 = local_38;
    if ((pGVar4->field_8).field_0x1 == '\x01') {
      fVar82 = pGVar4->fnumTimeSegments;
      fVar103 = (pGVar4->time_range).lower;
      auVar272._0_4_ = (pGVar4->time_range).upper - fVar103;
      auVar218._4_4_ = fVar103;
      auVar218._0_4_ = fVar103;
      auVar218._8_4_ = fVar103;
      auVar218._12_4_ = fVar103;
      auVar262._0_4_ = *(float *)(ray + 0x70) - fVar103;
      auVar262._4_4_ = *(float *)(ray + 0x74) - fVar103;
      auVar262._8_4_ = *(float *)(ray + 0x78) - fVar103;
      auVar262._12_4_ = *(float *)(ray + 0x7c) - fVar103;
      auVar272._4_4_ = auVar272._0_4_;
      auVar272._8_4_ = auVar272._0_4_;
      auVar272._12_4_ = auVar272._0_4_;
      auVar159 = divps(auVar262,auVar272);
      auVar298._0_4_ = auVar159._0_4_ * fVar82;
      auVar298._4_4_ = auVar159._4_4_ * fVar82;
      auVar298._8_4_ = auVar159._8_4_ * fVar82;
      auVar298._12_4_ = auVar159._12_4_ * fVar82;
      auVar159 = roundps(auVar218,auVar298,1);
      auVar276._0_4_ = fVar82 + -1.0;
      auVar276._4_4_ = auVar276._0_4_;
      auVar276._8_4_ = auVar276._0_4_;
      auVar276._12_4_ = auVar276._0_4_;
      auVar159 = minps(auVar159,auVar276);
      auVar159 = maxps(auVar159,ZEXT816(0));
      auVar317._0_4_ = auVar298._0_4_ - auVar159._0_4_;
      auVar317._4_4_ = auVar298._4_4_ - auVar159._4_4_;
      auVar317._8_4_ = auVar298._8_4_ - auVar159._8_4_;
      auVar317._12_4_ = auVar298._12_4_ - auVar159._12_4_;
      local_58._0_4_ = (undefined4)auVar159._0_4_;
      local_58._4_4_ = (undefined4)auVar159._4_4_;
      local_58._8_4_ = (undefined4)auVar159._8_4_;
      iStack_4c = (int)auVar159._12_4_;
      lVar6 = 0;
      if ((uVar10 & 0xff) != 0) {
        for (; ((uVar10 & 0xff) >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      iVar38 = *(int *)(local_58 + lVar6 * 4);
      auVar18._0_4_ = -(uint)(iVar38 == local_58._0_4_);
      auVar18._4_4_ = -(uint)(iVar38 == local_58._4_4_);
      auVar18._8_4_ = -(uint)(iVar38 == local_58._8_4_);
      auVar18._12_4_ = -(uint)(iVar38 == iStack_4c);
      auVar19 = ~auVar18 & local_38;
      iVar13 = movmskps(uVar39,auVar19);
      if (iVar13 == 0) {
        plVar11 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments + (long)iVar38 * 0x38);
        iVar38 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 + (long)iVar38 * 0x38);
        if (iVar38 == 0x9134) {
          lVar6 = *plVar11;
          lVar12 = plVar11[2] * uVar15;
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x10 + lVar12),0x1c);
          in_XMM14 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x20 + lVar12),0x28);
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 4 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x14 + lVar12),0x1c);
          auVar19 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x24 + lVar12),0x28);
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 8 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x18 + lVar12),0x1c);
          in_XMM8 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x28 + lVar12),0x28);
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                              *(undefined4 *)(lVar6 + 0x1c + lVar12),0x1c);
          in_XMM13 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x2c + lVar12),0x28);
        }
        else if (iVar38 == 0x9234) {
          lVar6 = *plVar11;
          lVar12 = plVar11[2] * uVar15;
          uVar2 = *(undefined8 *)(lVar6 + 4 + lVar12);
          in_XMM14._4_4_ = (int)uVar2;
          in_XMM14._0_4_ = *(undefined4 *)(lVar6 + lVar12);
          in_XMM14._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM14._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar6 + 0x10 + lVar12);
          auVar19._4_4_ = (int)uVar2;
          auVar19._0_4_ = *(undefined4 *)(lVar6 + 0xc + lVar12);
          uVar3 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
          in_XMM8._4_4_ = (int)uVar3;
          in_XMM8._0_4_ = *(undefined4 *)(lVar6 + 0x18 + lVar12);
          in_XMM8._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM8._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar6 + 0x28 + lVar12);
          auVar19._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar19._12_4_ = 0;
          in_XMM13._4_4_ = (int)uVar3;
          in_XMM13._0_4_ = *(undefined4 *)(lVar6 + 0x24 + lVar12);
          in_XMM13._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM13._12_4_ = 0;
        }
        else if (iVar38 == 0xb001) {
          lVar6 = *plVar11;
          lVar12 = plVar11[2] * uVar15;
          auVar220._8_8_ = 0;
          auVar220._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar12);
          auVar159 = insertps(auVar220,*(undefined4 *)(lVar6 + 8 + lVar12),0x20);
          uVar2 = *(undefined8 *)(lVar6 + 0x34 + lVar12);
          auVar302._4_4_ = (int)uVar2;
          auVar302._0_4_ = *(undefined4 *)(lVar6 + lVar12);
          auVar302._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar302._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
          auVar289._4_4_ = (int)uVar2;
          auVar289._0_4_ = *(undefined4 *)(lVar6 + 0x18 + lVar12);
          auVar289._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar289._12_4_ = 0;
          fVar82 = *(float *)(lVar6 + 0x24 + lVar12);
          fVar103 = *(float *)(lVar6 + 0x28 + lVar12);
          fVar104 = *(float *)(lVar6 + 0x2c + lVar12);
          fVar105 = *(float *)(lVar6 + 0x30 + lVar12);
          fVar78 = fVar105 * fVar105 + fVar104 * fVar104 + fVar82 * fVar82 + fVar103 * fVar103;
          auVar272 = rsqrtss(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
          fVar46 = auVar272._0_4_;
          auVar162._4_12_ = auVar272._4_12_;
          fVar46 = fVar46 * fVar46 * fVar78 * -0.5 * fVar46 + fVar46 * 1.5;
          in_XMM13 = insertps(auVar289,ZEXT416((uint)(fVar82 * fVar46)),0x30);
          in_XMM14 = insertps(auVar302,ZEXT416((uint)(fVar103 * fVar46)),0x30);
          auVar162._0_4_ = fVar46 * fVar105;
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                              *(undefined4 *)(lVar6 + 4 + lVar12),0x10);
          in_XMM8 = insertps(auVar159,auVar162,0x30);
          auVar272 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x3c + lVar12),0x20);
          auVar19 = insertps(auVar272,ZEXT416((uint)(fVar104 * fVar46)),0x30);
        }
        else if (iVar38 == 0x9244) {
          lVar6 = *plVar11;
          lVar12 = plVar11[2] * uVar15;
          in_XMM14 = *(undefined1 (*) [16])(lVar6 + lVar12);
          auVar19 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar12);
          in_XMM8 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar12);
          in_XMM13 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar12);
        }
        fVar149 = in_XMM14._0_4_;
        fVar150 = in_XMM14._4_4_;
        fVar151 = in_XMM14._8_4_;
        fVar152 = in_XMM14._12_4_;
        fVar82 = auVar19._0_4_;
        fVar103 = auVar19._4_4_;
        fVar104 = auVar19._8_4_;
        fVar105 = auVar19._12_4_;
        auVar113._4_4_ = fVar104;
        auVar113._0_4_ = fVar104;
        auVar113._8_4_ = fVar104;
        auVar113._12_4_ = fVar104;
        fVar78 = in_XMM8._0_4_;
        fVar190 = in_XMM8._4_4_;
        fVar245 = in_XMM8._8_4_;
        fVar192 = in_XMM8._12_4_;
        auVar232._4_4_ = fVar190;
        auVar232._0_4_ = fVar190;
        auVar232._8_4_ = fVar190;
        auVar232._12_4_ = fVar190;
        auVar265._4_4_ = fVar245;
        auVar265._0_4_ = fVar245;
        auVar265._8_4_ = fVar245;
        auVar265._12_4_ = fVar245;
        fVar107 = in_XMM13._0_4_;
        fVar154 = in_XMM13._4_4_;
        fVar106 = in_XMM13._8_4_;
        fVar46 = in_XMM13._12_4_;
        auVar205._4_4_ = fVar154;
        auVar205._0_4_ = fVar154;
        auVar205._8_4_ = fVar154;
        auVar205._12_4_ = fVar154;
        iVar38 = (int)plVar11[0xb];
        if (iVar38 == 0x9134) {
          lVar6 = plVar11[7];
          lVar12 = uVar15 * plVar11[9];
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x10 + lVar12),0x1c);
          auVar253 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x20 + lVar12),0x28);
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 4 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x14 + lVar12),0x1c);
          auVar232 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x24 + lVar12),0x28);
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 8 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x18 + lVar12),0x1c);
          auVar205 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x28 + lVar12),0x28);
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                              *(undefined4 *)(lVar6 + 0x1c + lVar12),0x1c);
          auVar265 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x2c + lVar12),0x28);
        }
        else if (iVar38 == 0x9234) {
          lVar6 = plVar11[7];
          lVar12 = uVar15 * plVar11[9];
          uVar2 = *(undefined8 *)(lVar6 + 4 + lVar12);
          auVar253._4_4_ = (int)uVar2;
          auVar253._0_4_ = *(undefined4 *)(lVar6 + lVar12);
          auVar253._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar253._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar6 + 0x10 + lVar12);
          auVar232._4_4_ = (int)uVar2;
          auVar232._0_4_ = *(undefined4 *)(lVar6 + 0xc + lVar12);
          auVar232._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar232._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
          auVar205._4_4_ = (int)uVar2;
          auVar205._0_4_ = *(undefined4 *)(lVar6 + 0x18 + lVar12);
          auVar205._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar205._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar6 + 0x28 + lVar12);
          auVar265._4_4_ = (int)uVar2;
          auVar265._0_4_ = *(undefined4 *)(lVar6 + 0x24 + lVar12);
          auVar265._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar265._12_4_ = 0;
        }
        else if (iVar38 == 0xb001) {
          lVar6 = plVar11[7];
          lVar12 = uVar15 * plVar11[9];
          auVar204._8_8_ = 0;
          auVar204._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar12);
          auVar159 = insertps(auVar204,*(undefined4 *)(lVar6 + 8 + lVar12),0x20);
          uVar2 = *(undefined8 *)(lVar6 + 0x34 + lVar12);
          auVar252._4_4_ = (int)uVar2;
          auVar252._0_4_ = *(undefined4 *)(lVar6 + lVar12);
          auVar252._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar252._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
          auVar264._4_4_ = (int)uVar2;
          auVar264._0_4_ = *(undefined4 *)(lVar6 + 0x18 + lVar12);
          auVar264._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar264._12_4_ = 0;
          fVar153 = *(float *)(lVar6 + 0x24 + lVar12);
          fVar155 = *(float *)(lVar6 + 0x28 + lVar12);
          fVar156 = *(float *)(lVar6 + 0x2c + lVar12);
          fVar170 = *(float *)(lVar6 + 0x30 + lVar12);
          fVar172 = fVar170 * fVar170 + fVar156 * fVar156 + fVar153 * fVar153 + fVar155 * fVar155;
          auVar272 = rsqrtss(ZEXT416((uint)fVar172),ZEXT416((uint)fVar172));
          fVar171 = auVar272._0_4_;
          auVar163._4_12_ = auVar272._4_12_;
          fVar171 = fVar171 * fVar171 * fVar172 * -0.5 * fVar171 + fVar171 * 1.5;
          auVar113 = ZEXT416((uint)(fVar153 * fVar171));
          auVar265 = insertps(auVar264,auVar113,0x30);
          auVar253 = insertps(auVar252,ZEXT416((uint)(fVar155 * fVar171)),0x30);
          auVar163._0_4_ = fVar171 * fVar170;
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                              *(undefined4 *)(lVar6 + 4 + lVar12),0x10);
          auVar205 = insertps(auVar159,auVar163,0x30);
          auVar272 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x3c + lVar12),0x20);
          auVar232 = insertps(auVar272,ZEXT416((uint)(fVar156 * fVar171)),0x30);
        }
        else {
          auVar253 = local_38;
          if (iVar38 == 0x9244) {
            lVar6 = plVar11[7];
            lVar12 = uVar15 * plVar11[9];
            auVar253 = *(undefined1 (*) [16])(lVar6 + lVar12);
            auVar232 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar12);
            auVar205 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar12);
            auVar265 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar12);
          }
        }
        auVar254._12_4_ = auVar253._12_4_;
        auVar254._4_4_ = auVar254._12_4_;
        auVar254._0_4_ = auVar254._12_4_;
        auVar254._8_4_ = auVar254._12_4_;
        auVar266._12_4_ = auVar265._12_4_;
        auVar266._4_4_ = auVar266._12_4_;
        auVar266._0_4_ = auVar266._12_4_;
        auVar266._8_4_ = auVar266._12_4_;
        auVar233._12_4_ = auVar232._12_4_;
        auVar233._4_4_ = auVar233._12_4_;
        auVar233._0_4_ = auVar233._12_4_;
        auVar233._8_4_ = auVar233._12_4_;
        auVar206._12_4_ = auVar205._12_4_;
        auVar206._4_4_ = auVar206._12_4_;
        auVar206._0_4_ = auVar206._12_4_;
        auVar206._8_4_ = auVar206._12_4_;
        auVar221._0_4_ =
             fVar192 * auVar206._12_4_ +
             fVar105 * auVar233._12_4_ + fVar152 * auVar254._12_4_ + fVar46 * auVar266._12_4_;
        auVar221._4_4_ =
             fVar192 * auVar206._12_4_ +
             fVar105 * auVar233._12_4_ + fVar152 * auVar254._12_4_ + fVar46 * auVar266._12_4_;
        auVar221._8_4_ =
             fVar192 * auVar206._12_4_ +
             fVar105 * auVar233._12_4_ + fVar152 * auVar254._12_4_ + fVar46 * auVar266._12_4_;
        auVar221._12_4_ =
             fVar192 * auVar206._12_4_ +
             fVar105 * auVar233._12_4_ + fVar152 * auVar254._12_4_ + fVar46 * auVar266._12_4_;
        uVar15 = CONCAT44(auVar221._4_4_,auVar221._0_4_);
        auVar303._0_8_ = uVar15 ^ 0x8000000080000000;
        auVar303._8_4_ = -auVar221._8_4_;
        auVar303._12_4_ = -auVar221._12_4_;
        auVar21._4_4_ = -(uint)(auVar221._4_4_ < -auVar221._4_4_);
        auVar21._0_4_ = -(uint)(auVar221._0_4_ < -auVar221._0_4_);
        auVar21._8_4_ = -(uint)(auVar221._8_4_ < auVar303._8_4_);
        auVar21._12_4_ = -(uint)(auVar221._12_4_ < auVar303._12_4_);
        uVar15 = CONCAT44(auVar266._12_4_,auVar266._12_4_);
        auVar86._0_8_ = uVar15 ^ 0x8000000080000000;
        auVar86._8_4_ = -auVar266._12_4_;
        auVar86._12_4_ = -auVar266._12_4_;
        auVar262 = blendvps(auVar266,auVar86,auVar21);
        uVar15 = CONCAT44(auVar254._12_4_,auVar254._12_4_);
        auVar87._0_8_ = uVar15 ^ 0x8000000080000000;
        auVar87._8_4_ = -auVar254._12_4_;
        auVar87._12_4_ = -auVar254._12_4_;
        auVar218 = blendvps(auVar254,auVar87,auVar21);
        uVar15 = CONCAT44(auVar233._12_4_,auVar233._12_4_);
        auVar88._0_8_ = uVar15 ^ 0x8000000080000000;
        auVar88._8_4_ = -auVar233._12_4_;
        auVar88._12_4_ = -auVar233._12_4_;
        auVar276 = blendvps(auVar233,auVar88,auVar21);
        uVar15 = CONCAT44(auVar206._12_4_,auVar206._12_4_);
        auVar89._0_8_ = uVar15 ^ 0x8000000080000000;
        auVar89._8_4_ = -auVar206._12_4_;
        auVar89._12_4_ = -auVar206._12_4_;
        auVar159 = blendvps(auVar206,auVar89,auVar21);
        auVar298 = maxps(auVar303,auVar221);
        fVar153 = ABS(auVar221._0_4_);
        fVar155 = ABS(auVar221._4_4_);
        fVar156 = ABS(auVar221._8_4_);
        fVar170 = ABS(auVar221._12_4_);
        auVar90._0_4_ = 1.0 - fVar153;
        auVar90._4_4_ = 1.0 - fVar155;
        auVar90._8_4_ = 1.0 - fVar156;
        auVar90._12_4_ = 1.0 - fVar170;
        auVar272 = sqrtps(auVar90,auVar90);
        auVar22._0_4_ =
             1.5707964 -
             auVar272._0_4_ *
             (((((fVar153 * -0.0043095737 + 0.0192803) * fVar153 + -0.04489909) * fVar153 +
               0.08785567) * fVar153 + -0.21450998) * fVar153 + 1.5707952);
        auVar22._4_4_ =
             1.5707964 -
             auVar272._4_4_ *
             (((((fVar155 * -0.0043095737 + 0.0192803) * fVar155 + -0.04489909) * fVar155 +
               0.08785567) * fVar155 + -0.21450998) * fVar155 + 1.5707952);
        auVar22._8_4_ =
             1.5707964 -
             auVar272._8_4_ *
             (((((fVar156 * -0.0043095737 + 0.0192803) * fVar156 + -0.04489909) * fVar156 +
               0.08785567) * fVar156 + -0.21450998) * fVar156 + 1.5707952);
        auVar22._12_4_ =
             1.5707964 -
             auVar272._12_4_ *
             (((((fVar170 * -0.0043095737 + 0.0192803) * fVar170 + -0.04489909) * fVar170 +
               0.08785567) * fVar170 + -0.21450998) * fVar170 + 1.5707952);
        auVar272 = maxps(ZEXT816(0),auVar22);
        fVar311 = auVar298._0_4_;
        fVar268 = auVar298._4_4_;
        fVar269 = auVar298._8_4_;
        fVar270 = auVar298._12_4_;
        auVar23._4_4_ = -(uint)(fVar268 < 0.0);
        auVar23._0_4_ = -(uint)(fVar311 < 0.0);
        auVar23._8_4_ = -(uint)(fVar269 < 0.0);
        auVar23._12_4_ = -(uint)(fVar270 < 0.0);
        auVar180._0_8_ = auVar272._0_8_ ^ 0x8000000080000000;
        auVar180._8_4_ = auVar272._8_4_ ^ 0x80000000;
        auVar180._12_4_ = auVar272._12_4_ ^ 0x80000000;
        auVar272 = blendvps(auVar272,auVar180,auVar23);
        auVar181._0_4_ = 1.5707964 - auVar272._0_4_;
        auVar181._4_4_ = 1.5707964 - auVar272._4_4_;
        auVar181._8_4_ = 1.5707964 - auVar272._8_4_;
        auVar181._12_4_ = 1.5707964 - auVar272._12_4_;
        auVar24._4_4_ = -(uint)(1.0 < fVar155);
        auVar24._0_4_ = -(uint)(1.0 < fVar153);
        auVar24._8_4_ = -(uint)(1.0 < fVar156);
        auVar24._12_4_ = -(uint)(1.0 < fVar170);
        auVar272 = blendvps(auVar181,_DAT_01f80c30,auVar24);
        fVar153 = auVar272._0_4_ * auVar317._0_4_;
        fVar155 = auVar272._4_4_ * auVar317._4_4_;
        fVar156 = auVar272._8_4_ * auVar317._8_4_;
        fVar170 = auVar272._12_4_ * auVar317._12_4_;
        auVar25._0_4_ = fVar153 * 0.63661975;
        auVar25._4_4_ = fVar155 * 0.63661975;
        auVar25._8_4_ = fVar156 * 0.63661975;
        auVar25._12_4_ = fVar170 * 0.63661975;
        auVar272 = roundps(auVar113,auVar25,1);
        auVar26._0_8_ = CONCAT44((int)auVar272._4_4_,(int)auVar272._0_4_);
        auVar26._8_4_ = (int)auVar272._8_4_;
        auVar26._12_4_ = (int)auVar272._12_4_;
        fVar153 = fVar153 - auVar272._0_4_ * 1.5707964;
        fVar155 = fVar155 - auVar272._4_4_ * 1.5707964;
        fVar156 = fVar156 - auVar272._8_4_ * 1.5707964;
        fVar170 = fVar170 - auVar272._12_4_ * 1.5707964;
        auVar234._0_8_ = auVar26._0_8_ & 0x300000003;
        auVar234._8_8_ = auVar26._8_8_ & 0x300000003;
        fVar171 = fVar153 * fVar153;
        fVar172 = fVar155 * fVar155;
        fVar173 = fVar156 * fVar156;
        fVar175 = fVar170 * fVar170;
        uVar15 = auVar26._0_8_ & (ulong)DAT_01f7bb20;
        uVar42 = auVar26._8_8_ & DAT_01f7bb20._8_8_;
        iVar38 = (int)uVar15;
        auVar164._0_4_ = -(uint)(iVar38 == 0);
        iVar13 = (int)(uVar15 >> 0x20);
        auVar164._4_4_ = -(uint)(iVar13 == 0);
        iVar174 = (int)uVar42;
        iVar177 = (int)(uVar42 >> 0x20);
        auVar164._8_4_ = -(uint)(iVar174 == 0);
        auVar164._12_4_ = -(uint)(iVar177 == 0);
        auVar91._4_4_ = -iVar13;
        auVar91._0_4_ = -iVar38;
        auVar91._8_4_ = -iVar174;
        auVar91._12_4_ = -iVar177;
        auVar280._0_8_ =
             CONCAT44((((((fVar172 * -2.5029328e-08 + 2.7600126e-06) * fVar172 + -0.00019842605) *
                         fVar172 + 0.008333348) * fVar172 + -0.16666667) * fVar172 + 1.0) * fVar155,
                      (((((fVar171 * -2.5029328e-08 + 2.7600126e-06) * fVar171 + -0.00019842605) *
                         fVar171 + 0.008333348) * fVar171 + -0.16666667) * fVar171 + 1.0) * fVar153)
        ;
        auVar280._8_4_ =
             (((((fVar173 * -2.5029328e-08 + 2.7600126e-06) * fVar173 + -0.00019842605) * fVar173 +
               0.008333348) * fVar173 + -0.16666667) * fVar173 + 1.0) * fVar156;
        auVar280._12_4_ =
             (((((fVar175 * -2.5029328e-08 + 2.7600126e-06) * fVar175 + -0.00019842605) * fVar175 +
               0.008333348) * fVar175 + -0.16666667) * fVar175 + 1.0) * fVar170;
        auVar207._0_4_ =
             ((((fVar171 * -2.5963018e-07 + 2.4756235e-05) * fVar171 + -0.001388833) * fVar171 +
              0.04166664) * fVar171 + -0.5) * fVar171 + 1.0;
        auVar207._4_4_ =
             ((((fVar172 * -2.5963018e-07 + 2.4756235e-05) * fVar172 + -0.001388833) * fVar172 +
              0.04166664) * fVar172 + -0.5) * fVar172 + 1.0;
        auVar207._8_4_ =
             ((((fVar173 * -2.5963018e-07 + 2.4756235e-05) * fVar173 + -0.001388833) * fVar173 +
              0.04166664) * fVar173 + -0.5) * fVar173 + 1.0;
        auVar207._12_4_ =
             ((((fVar175 * -2.5963018e-07 + 2.4756235e-05) * fVar175 + -0.001388833) * fVar175 +
              0.04166664) * fVar175 + -0.5) * fVar175 + 1.0;
        auVar182._8_4_ = auVar280._8_4_;
        auVar182._0_8_ = auVar280._0_8_;
        auVar182._12_4_ = auVar280._12_4_;
        auVar272 = blendvps(auVar182,auVar207,auVar91);
        auVar298 = blendvps(auVar280,auVar207,auVar164);
        uVar40 = (uint)DAT_01f7bb20;
        auVar27._0_4_ = -(uint)((int)uVar40 < (int)auVar234._0_8_);
        iVar38 = (int)(auVar234._0_8_ >> 0x20);
        uVar41 = DAT_01f7bb20._4_4_;
        auVar27._4_4_ = -(uint)((int)uVar41 < iVar38);
        uVar44 = DAT_01f7bb20._8_4_;
        iVar13 = (int)(auVar234._8_8_ >> 0x20);
        auVar27._8_4_ = -(uint)((int)uVar44 < (int)auVar234._8_8_);
        uVar45 = DAT_01f7bb20._12_4_;
        auVar27._12_4_ = -(uint)((int)uVar45 < iVar13);
        auVar92._0_8_ = auVar272._0_8_ ^ 0x8000000080000000;
        auVar92._8_4_ = auVar272._8_4_ ^ 0x80000000;
        auVar92._12_4_ = auVar272._12_4_ ^ 0x80000000;
        auVar272 = blendvps(auVar272,auVar92,auVar27);
        uVar14 = (int)auVar234._0_8_ - 1;
        uVar39 = iVar38 - 1;
        uVar10 = (int)auVar234._8_8_ - 1;
        uVar43 = iVar13 - 1;
        auVar114._0_4_ =
             -(uint)(((uVar14 < uVar40) * uVar14 | (uVar14 >= uVar40) * uVar40) == uVar14);
        auVar114._4_4_ =
             -(uint)(((uVar39 < uVar41) * uVar39 | (uVar39 >= uVar41) * uVar41) == uVar39);
        auVar114._8_4_ =
             -(uint)(((uVar10 < uVar44) * uVar10 | (uVar10 >= uVar44) * uVar44) == uVar10);
        auVar114._12_4_ =
             -(uint)(((uVar43 < uVar45) * uVar43 | (uVar43 >= uVar45) * uVar45) == uVar43);
        auVar194._0_8_ = auVar298._0_8_ ^ 0x8000000080000000;
        auVar194._8_4_ = auVar298._8_4_ ^ 0x80000000;
        auVar194._12_4_ = auVar298._12_4_ ^ 0x80000000;
        auVar298 = blendvps(auVar298,auVar194,auVar114);
        fVar153 = fVar46 * fVar311 - auVar262._0_4_;
        fVar155 = fVar46 * fVar268 - auVar262._4_4_;
        fVar156 = fVar46 * fVar269 - auVar262._8_4_;
        fVar170 = fVar46 * fVar270 - auVar262._12_4_;
        local_1c8._0_4_ = auVar218._0_4_;
        local_1c8._4_4_ = auVar218._4_4_;
        fStack_1c0 = auVar218._8_4_;
        fStack_1bc = auVar218._12_4_;
        fVar175 = fVar152 * fVar311 - (float)local_1c8._0_4_;
        fVar176 = fVar152 * fVar268 - (float)local_1c8._4_4_;
        fVar178 = fVar152 * fVar269 - fStack_1c0;
        fVar188 = fVar152 * fVar270 - fStack_1bc;
        fVar189 = fVar105 * fVar311 - auVar276._0_4_;
        fVar191 = fVar105 * fVar268 - auVar276._4_4_;
        fVar197 = fVar105 * fVar269 - auVar276._8_4_;
        fVar198 = fVar105 * fVar270 - auVar276._12_4_;
        local_268._0_4_ = auVar159._0_4_;
        local_268._4_4_ = auVar159._4_4_;
        uStack_260._0_4_ = auVar159._8_4_;
        uStack_260._4_4_ = auVar159._12_4_;
        fVar240 = fVar192 * fVar311 - (float)local_268._0_4_;
        fVar241 = fVar192 * fVar268 - (float)local_268._4_4_;
        fVar242 = fVar192 * fVar269 - (float)uStack_260;
        fVar243 = fVar192 * fVar270 - uStack_260._4_4_;
        auVar93._0_4_ =
             fVar240 * fVar240 + fVar189 * fVar189 + fVar175 * fVar175 + fVar153 * fVar153;
        auVar93._4_4_ =
             fVar241 * fVar241 + fVar191 * fVar191 + fVar176 * fVar176 + fVar155 * fVar155;
        auVar93._8_4_ =
             fVar242 * fVar242 + fVar197 * fVar197 + fVar178 * fVar178 + fVar156 * fVar156;
        auVar93._12_4_ =
             fVar243 * fVar243 + fVar198 * fVar198 + fVar188 * fVar188 + fVar170 * fVar170;
        auVar159 = rsqrtps(auVar234,auVar93);
        fVar171 = auVar159._0_4_;
        fVar172 = auVar159._4_4_;
        fVar173 = auVar159._8_4_;
        fVar199 = auVar159._12_4_;
        fVar313 = fVar171 * 1.5 - fVar171 * fVar171 * auVar93._0_4_ * 0.5 * fVar171;
        fVar321 = fVar172 * 1.5 - fVar172 * fVar172 * auVar93._4_4_ * 0.5 * fVar172;
        fVar324 = fVar173 * 1.5 - fVar173 * fVar173 * auVar93._8_4_ * 0.5 * fVar173;
        fVar327 = fVar199 * 1.5 - fVar199 * fVar199 * auVar93._12_4_ * 0.5 * fVar199;
        fVar199 = auVar272._0_4_;
        fVar213 = auVar272._4_4_;
        fVar215 = auVar272._8_4_;
        fVar228 = auVar272._12_4_;
        fVar294 = auVar298._0_4_;
        fVar295 = auVar298._4_4_;
        fVar307 = auVar298._8_4_;
        fVar309 = auVar298._12_4_;
        local_208._4_4_ = fVar46 * fVar295 - fVar155 * fVar321 * fVar213;
        local_208._0_4_ = fVar46 * fVar294 - fVar153 * fVar313 * fVar199;
        fStack_200 = fVar46 * fVar307 - fVar156 * fVar324 * fVar215;
        fStack_1fc = fVar46 * fVar309 - fVar170 * fVar327 * fVar228;
        fVar171 = (auVar262._0_4_ - fVar46) * auVar317._0_4_ + fVar46;
        fVar172 = (auVar262._4_4_ - fVar46) * auVar317._4_4_ + fVar46;
        fVar173 = (auVar262._8_4_ - fVar46) * auVar317._8_4_ + fVar46;
        fVar46 = (auVar262._12_4_ - fVar46) * auVar317._12_4_ + fVar46;
        fVar153 = ((float)local_1c8._0_4_ - fVar152) * auVar317._0_4_ + fVar152;
        fVar155 = ((float)local_1c8._4_4_ - fVar152) * auVar317._4_4_ + fVar152;
        fVar156 = (fStack_1c0 - fVar152) * auVar317._8_4_ + fVar152;
        fVar170 = (fStack_1bc - fVar152) * auVar317._12_4_ + fVar152;
        fVar200 = (auVar276._0_4_ - fVar105) * auVar317._0_4_ + fVar105;
        fVar214 = (auVar276._4_4_ - fVar105) * auVar317._4_4_ + fVar105;
        fVar227 = (auVar276._8_4_ - fVar105) * auVar317._8_4_ + fVar105;
        fVar239 = (auVar276._12_4_ - fVar105) * auVar317._12_4_ + fVar105;
        auVar208._0_4_ = fVar200 * fVar200 + fVar153 * fVar153 + fVar171 * fVar171;
        auVar208._4_4_ = fVar214 * fVar214 + fVar155 * fVar155 + fVar172 * fVar172;
        auVar208._8_4_ = fVar227 * fVar227 + fVar156 * fVar156 + fVar173 * fVar173;
        auVar208._12_4_ = fVar239 * fVar239 + fVar170 * fVar170 + fVar46 * fVar46;
        fVar286 = ((float)local_268._0_4_ - fVar192) * auVar317._0_4_ + fVar192;
        fVar287 = ((float)local_268._4_4_ - fVar192) * auVar317._4_4_ + fVar192;
        fVar292 = ((float)uStack_260 - fVar192) * auVar317._8_4_ + fVar192;
        fVar293 = (uStack_260._4_4_ - fVar192) * auVar317._12_4_ + fVar192;
        auVar222._0_4_ = fVar286 * fVar286 + auVar208._0_4_;
        auVar222._4_4_ = fVar287 * fVar287 + auVar208._4_4_;
        auVar222._8_4_ = fVar292 * fVar292 + auVar208._8_4_;
        auVar222._12_4_ = fVar293 * fVar293 + auVar208._12_4_;
        auVar272 = rsqrtps(auVar208,auVar222);
        fVar244 = auVar272._0_4_;
        fVar255 = auVar272._4_4_;
        fVar256 = auVar272._8_4_;
        fVar257 = auVar272._12_4_;
        fVar244 = fVar244 * 1.5 - fVar244 * fVar244 * auVar222._0_4_ * 0.5 * fVar244;
        fVar255 = fVar255 * 1.5 - fVar255 * fVar255 * auVar222._4_4_ * 0.5 * fVar255;
        fVar256 = fVar256 * 1.5 - fVar256 * fVar256 * auVar222._8_4_ * 0.5 * fVar256;
        fVar257 = fVar257 * 1.5 - fVar257 * fVar257 * auVar222._12_4_ * 0.5 * fVar257;
        auVar94._0_4_ = fVar171 * fVar244;
        auVar94._4_4_ = fVar172 * fVar255;
        auVar94._8_4_ = fVar173 * fVar256;
        auVar94._12_4_ = fVar46 * fVar257;
        auVar28._4_4_ = -(uint)(0.9995 < fVar268);
        auVar28._0_4_ = -(uint)(0.9995 < fVar311);
        auVar28._8_4_ = -(uint)(0.9995 < fVar269);
        auVar28._12_4_ = -(uint)(0.9995 < fVar270);
        auVar272 = blendvps(_local_208,auVar94,auVar28);
        auVar209._0_4_ = fVar152 * fVar294 - fVar175 * fVar313 * fVar199;
        auVar209._4_4_ = fVar152 * fVar295 - fVar176 * fVar321 * fVar213;
        auVar209._8_4_ = fVar152 * fVar307 - fVar178 * fVar324 * fVar215;
        auVar209._12_4_ = fVar152 * fVar309 - fVar188 * fVar327 * fVar228;
        auVar73._0_4_ = fVar153 * fVar244;
        auVar73._4_4_ = fVar155 * fVar255;
        auVar73._8_4_ = fVar156 * fVar256;
        auVar73._12_4_ = fVar170 * fVar257;
        auVar159 = blendvps(auVar209,auVar73,auVar28);
        auVar223._0_4_ = fVar105 * fVar294 - fVar189 * fVar313 * fVar199;
        auVar223._4_4_ = fVar105 * fVar295 - fVar191 * fVar321 * fVar213;
        auVar223._8_4_ = fVar105 * fVar307 - fVar197 * fVar324 * fVar215;
        auVar223._12_4_ = fVar105 * fVar309 - fVar198 * fVar327 * fVar228;
        auVar183._0_4_ = fVar200 * fVar244;
        auVar183._4_4_ = fVar214 * fVar255;
        auVar183._8_4_ = fVar227 * fVar256;
        auVar183._12_4_ = fVar239 * fVar257;
        auVar276 = blendvps(auVar223,auVar183,auVar28);
        auVar281._0_4_ = fVar294 * fVar192 - fVar313 * fVar240 * fVar199;
        auVar281._4_4_ = fVar295 * fVar192 - fVar321 * fVar241 * fVar213;
        auVar281._8_4_ = fVar307 * fVar192 - fVar324 * fVar242 * fVar215;
        auVar281._12_4_ = fVar309 * fVar192 - fVar327 * fVar243 * fVar228;
        auVar267._0_4_ = fVar244 * fVar286;
        auVar267._4_4_ = fVar255 * fVar287;
        auVar267._8_4_ = fVar256 * fVar292;
        auVar267._12_4_ = fVar257 * fVar293;
        auVar218 = blendvps(auVar281,auVar267,auVar28);
        local_78._0_4_ = auVar253._0_4_;
        fVar105 = 1.0 - auVar317._0_4_;
        fVar46 = 1.0 - auVar317._4_4_;
        fVar192 = 1.0 - auVar317._8_4_;
        fVar152 = 1.0 - auVar317._12_4_;
        local_218._4_4_ = fVar149 * fVar46 + (float)local_78._0_4_ * auVar317._4_4_;
        local_218._0_4_ = fVar149 * fVar105 + (float)local_78._0_4_ * auVar317._0_4_;
        uStack_210._0_4_ = fVar149 * fVar192 + (float)local_78._0_4_ * auVar317._8_4_;
        uStack_210._4_4_ = fVar149 * fVar152 + (float)local_78._0_4_ * auVar317._12_4_;
        local_168._4_4_ = auVar253._4_4_;
        local_278._4_4_ = fVar150 * fVar46 + (float)local_168._4_4_ * auVar317._4_4_;
        local_278._0_4_ = fVar150 * fVar105 + (float)local_168._4_4_ * auVar317._0_4_;
        uStack_270._0_4_ = fVar150 * fVar192 + (float)local_168._4_4_ * auVar317._8_4_;
        uStack_270._4_4_ = fVar150 * fVar152 + (float)local_168._4_4_ * auVar317._12_4_;
        fStack_120 = auVar253._8_4_;
        local_238._4_4_ = fVar151 * fVar46 + fStack_120 * auVar317._4_4_;
        local_238._0_4_ = fVar151 * fVar105 + fStack_120 * auVar317._0_4_;
        uStack_230._0_4_ = fVar151 * fVar192 + fStack_120 * auVar317._8_4_;
        uStack_230._4_4_ = fVar151 * fVar152 + fStack_120 * auVar317._12_4_;
        local_98._0_4_ = auVar232._0_4_;
        local_258._4_4_ = fVar82 * fVar46 + (float)local_98._0_4_ * auVar317._4_4_;
        local_258._0_4_ = fVar82 * fVar105 + (float)local_98._0_4_ * auVar317._0_4_;
        fStack_250 = fVar82 * fVar192 + (float)local_98._0_4_ * auVar317._8_4_;
        fStack_24c = fVar82 * fVar152 + (float)local_98._0_4_ * auVar317._12_4_;
        local_88._4_4_ = auVar232._4_4_;
        local_1d8._4_4_ = fVar103 * fVar46 + (float)local_88._4_4_ * auVar317._4_4_;
        local_1d8._0_4_ = fVar103 * fVar105 + (float)local_88._4_4_ * auVar317._0_4_;
        fStack_1d0 = fVar103 * fVar192 + (float)local_88._4_4_ * auVar317._8_4_;
        fStack_1cc = fVar103 * fVar152 + (float)local_88._4_4_ * auVar317._12_4_;
        fStack_60 = auVar232._8_4_;
        local_228._4_4_ = fVar104 * fVar46 + fStack_60 * auVar317._4_4_;
        local_228._0_4_ = fVar104 * fVar105 + fStack_60 * auVar317._0_4_;
        uStack_220._0_4_ = fVar104 * fVar192 + fStack_60 * auVar317._8_4_;
        uStack_220._4_4_ = fVar104 * fVar152 + fStack_60 * auVar317._12_4_;
        local_d8._0_4_ = auVar205._0_4_;
        local_248._4_4_ = fVar78 * fVar46 + (float)local_d8._0_4_ * auVar317._4_4_;
        local_248._0_4_ = fVar78 * fVar105 + (float)local_d8._0_4_ * auVar317._0_4_;
        fStack_240 = fVar78 * fVar192 + (float)local_d8._0_4_ * auVar317._8_4_;
        fStack_23c = fVar78 * fVar152 + (float)local_d8._0_4_ * auVar317._12_4_;
        local_138._4_4_ = auVar205._4_4_;
        fStack_150 = auVar205._8_4_;
        local_148._0_4_ = auVar265._0_4_;
        local_108._4_4_ = auVar265._4_4_;
        fStack_110 = auVar265._8_4_;
        local_1a8._4_4_ = fVar190 * fVar46 + (float)local_138._4_4_ * auVar317._4_4_;
        local_1a8._0_4_ = fVar190 * fVar105 + (float)local_138._4_4_ * auVar317._0_4_;
        fStack_1a0 = fVar190 * fVar192 + (float)local_138._4_4_ * auVar317._8_4_;
        fStack_19c = fVar190 * fVar152 + (float)local_138._4_4_ * auVar317._12_4_;
        local_1b8._4_4_ = fVar245 * fVar46 + fStack_150 * auVar317._4_4_;
        local_1b8._0_4_ = fVar245 * fVar105 + fStack_150 * auVar317._0_4_;
        fStack_1b0 = fVar245 * fVar192 + fStack_150 * auVar317._8_4_;
        fStack_1ac = fVar245 * fVar152 + fStack_150 * auVar317._12_4_;
        local_188._4_4_ = fVar107 * fVar46 + (float)local_148._0_4_ * auVar317._4_4_;
        local_188._0_4_ = fVar107 * fVar105 + (float)local_148._0_4_ * auVar317._0_4_;
        fStack_180 = fVar107 * fVar192 + (float)local_148._0_4_ * auVar317._8_4_;
        fStack_17c = fVar107 * fVar152 + (float)local_148._0_4_ * auVar317._12_4_;
        local_198._4_4_ = fVar154 * fVar46 + (float)local_108._4_4_ * auVar317._4_4_;
        local_198._0_4_ = fVar154 * fVar105 + (float)local_108._4_4_ * auVar317._0_4_;
        fStack_190 = fVar154 * fVar192 + (float)local_108._4_4_ * auVar317._8_4_;
        fStack_18c = fVar154 * fVar152 + (float)local_108._4_4_ * auVar317._12_4_;
        local_268._4_4_ = fVar46 * fVar106 + fStack_110 * auVar317._4_4_;
        local_268._0_4_ = fVar105 * fVar106 + fStack_110 * auVar317._0_4_;
        uStack_260._0_4_ = fVar192 * fVar106 + fStack_110 * auVar317._8_4_;
        uStack_260._4_4_ = fVar152 * fVar106 + fStack_110 * auVar317._12_4_;
        fVar107 = auVar159._0_4_;
        fVar106 = auVar159._4_4_;
        fVar152 = auVar159._12_4_;
        local_208._0_4_ = auVar272._0_4_;
        local_208._4_4_ = auVar272._4_4_;
        fStack_200 = auVar272._8_4_;
        fStack_1fc = auVar272._12_4_;
        fVar150 = auVar159._8_4_;
        fVar176 = auVar276._0_4_;
        fVar178 = auVar276._4_4_;
        fVar188 = auVar276._8_4_;
        fVar189 = auVar276._12_4_;
        fVar227 = auVar218._0_4_;
        fVar228 = auVar218._4_4_;
        fVar239 = auVar218._8_4_;
        fVar240 = auVar218._12_4_;
        fVar82 = fVar107 * fVar176 + (float)local_208._0_4_ * fVar227;
        fVar103 = fVar106 * fVar178 + (float)local_208._4_4_ * fVar228;
        fVar104 = fVar150 * fVar188 + fStack_200 * fVar239;
        fVar105 = fVar152 * fVar189 + fStack_1fc * fVar240;
        fVar241 = fVar107 * fVar176 - (float)local_208._0_4_ * fVar227;
        fVar242 = fVar106 * fVar178 - (float)local_208._4_4_ * fVar228;
        fVar243 = fVar150 * fVar188 - fStack_200 * fVar239;
        fVar244 = fVar152 * fVar189 - fStack_1fc * fVar240;
        fVar200 = fVar176 * fVar176;
        fVar213 = fVar178 * fVar178;
        fVar214 = fVar188 * fVar188;
        fVar215 = fVar189 * fVar189;
        fVar171 = ((float)local_208._0_4_ * (float)local_208._0_4_ + fVar107 * fVar107) - fVar200;
        fVar172 = ((float)local_208._4_4_ * (float)local_208._4_4_ + fVar106 * fVar106) - fVar213;
        fVar173 = (fStack_200 * fStack_200 + fVar150 * fVar150) - fVar214;
        fVar175 = (fStack_1fc * fStack_1fc + fVar152 * fVar152) - fVar215;
        fVar46 = (float)local_208._0_4_ * (float)local_208._0_4_ - fVar107 * fVar107;
        fVar78 = (float)local_208._4_4_ * (float)local_208._4_4_ - fVar106 * fVar106;
        fVar190 = fStack_200 * fStack_200 - fVar150 * fVar150;
        fVar245 = fStack_1fc * fStack_1fc - fVar152 * fVar152;
        fVar192 = fVar107 * fVar227 - (float)local_208._0_4_ * fVar176;
        fVar154 = fVar106 * fVar228 - (float)local_208._4_4_ * fVar178;
        fVar149 = fVar150 * fVar239 - fStack_200 * fVar188;
        fVar151 = fVar152 * fVar240 - fStack_1fc * fVar189;
        fVar153 = (float)local_208._0_4_ * fVar176 + fVar107 * fVar227;
        fVar155 = (float)local_208._4_4_ * fVar178 + fVar106 * fVar228;
        fVar156 = fStack_200 * fVar188 + fVar150 * fVar239;
        fVar170 = fStack_1fc * fVar189 + fVar152 * fVar240;
        fVar191 = fVar227 * fVar176 + fVar107 * (float)local_208._0_4_;
        fVar197 = fVar228 * fVar178 + fVar106 * (float)local_208._4_4_;
        fVar198 = fVar239 * fVar188 + fVar150 * fStack_200;
        fVar199 = fVar240 * fVar189 + fVar152 * fStack_1fc;
        fVar107 = fVar227 * fVar176 - fVar107 * (float)local_208._0_4_;
        fVar106 = fVar228 * fVar178 - fVar106 * (float)local_208._4_4_;
        fVar150 = fVar239 * fVar188 - fVar150 * fStack_200;
        fVar152 = fVar240 * fVar189 - fVar152 * fStack_1fc;
      }
      else {
        auVar167 = auVar317;
        _local_288 = local_38;
        do {
          lVar6 = 0;
          if ((uVar10 & 0xf) != 0) {
            for (; ((uVar10 & 0xf) >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          iVar38 = *(int *)(local_58 + (long)(int)lVar6 * 4);
          auVar30._0_4_ = -(uint)(iVar38 == local_58._0_4_);
          auVar30._4_4_ = -(uint)(iVar38 == local_58._4_4_);
          auVar30._8_4_ = -(uint)(iVar38 == local_58._8_4_);
          auVar30._12_4_ = -(uint)(iVar38 == iStack_4c);
          auVar30 = auVar30 & _local_288;
          plVar11 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments + (long)iVar38 * 0x38);
          iVar38 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 + (long)iVar38 * 0x38);
          if (iVar38 == 0x9134) {
            lVar6 = *plVar11;
            lVar12 = plVar11[2] * uVar15;
            auVar276 = insertps(ZEXT416(*(uint *)(lVar6 + lVar12)),
                                *(undefined4 *)(lVar6 + 0x10 + lVar12),0x1c);
            in_XMM14 = insertps(auVar276,*(undefined4 *)(lVar6 + 0x20 + lVar12),0x28);
            auVar276 = insertps(ZEXT416(*(uint *)(lVar6 + 4 + lVar12)),
                                *(undefined4 *)(lVar6 + 0x14 + lVar12),0x1c);
            in_XMM11 = insertps(auVar276,*(undefined4 *)(lVar6 + 0x24 + lVar12),0x28);
            auVar276 = insertps(ZEXT416(*(uint *)(lVar6 + 8 + lVar12)),
                                *(undefined4 *)(lVar6 + 0x18 + lVar12),0x1c);
            local_f8 = insertps(auVar276,*(undefined4 *)(lVar6 + 0x28 + lVar12),0x28);
            auVar276 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                                *(undefined4 *)(lVar6 + 0x1c + lVar12),0x1c);
            in_XMM9 = insertps(auVar276,*(undefined4 *)(lVar6 + 0x2c + lVar12),0x28);
          }
          else if (iVar38 == 0x9234) {
            lVar6 = *plVar11;
            lVar12 = plVar11[2] * uVar15;
            uVar2 = *(undefined8 *)(lVar6 + 4 + lVar12);
            in_XMM14._4_4_ = (int)uVar2;
            in_XMM14._0_4_ = *(undefined4 *)(lVar6 + lVar12);
            in_XMM14._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM14._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x10 + lVar12);
            in_XMM11._4_4_ = (int)uVar2;
            in_XMM11._0_4_ = *(undefined4 *)(lVar6 + 0xc + lVar12);
            in_XMM11._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM11._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
            local_f8._4_4_ = (int)uVar2;
            local_f8._0_4_ = *(undefined4 *)(lVar6 + 0x18 + lVar12);
            local_f8._8_4_ = (int)((ulong)uVar2 >> 0x20);
            local_f8._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x28 + lVar12);
            in_XMM9._4_4_ = (int)uVar2;
            in_XMM9._0_4_ = *(undefined4 *)(lVar6 + 0x24 + lVar12);
            in_XMM9._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM9._12_4_ = 0;
          }
          else if (iVar38 == 0xb001) {
            lVar6 = *plVar11;
            lVar12 = plVar11[2] * uVar15;
            auVar195._8_8_ = 0;
            auVar195._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar12);
            auVar276 = insertps(auVar195,*(undefined4 *)(lVar6 + 8 + lVar12),0x20);
            uVar2 = *(undefined8 *)(lVar6 + 0x34 + lVar12);
            auVar305._4_4_ = (int)uVar2;
            auVar305._0_4_ = *(undefined4 *)(lVar6 + lVar12);
            auVar305._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar305._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
            auVar236._4_4_ = (int)uVar2;
            auVar236._0_4_ = *(undefined4 *)(lVar6 + 0x18 + lVar12);
            auVar236._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar236._12_4_ = 0;
            fVar82 = *(float *)(lVar6 + 0x24 + lVar12);
            fVar103 = *(float *)(lVar6 + 0x28 + lVar12);
            fVar104 = *(float *)(lVar6 + 0x2c + lVar12);
            fVar105 = *(float *)(lVar6 + 0x30 + lVar12);
            fVar46 = fVar105 * fVar105 + fVar104 * fVar104 + fVar82 * fVar82 + fVar103 * fVar103;
            auVar218 = rsqrtss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
            fVar78 = auVar218._0_4_;
            fVar46 = fVar78 * fVar78 * fVar46 * -0.5 * fVar78 + fVar78 * 1.5;
            in_XMM9 = insertps(auVar236,ZEXT416((uint)(fVar82 * fVar46)),0x30);
            in_XMM14 = insertps(auVar305,ZEXT416((uint)(fVar103 * fVar46)),0x30);
            auVar320._0_4_ = fVar46 * fVar105;
            auVar320._4_12_ = auVar218._4_12_;
            auVar218 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                                *(undefined4 *)(lVar6 + 4 + lVar12),0x10);
            local_f8 = insertps(auVar276,auVar320,0x30);
            auVar276 = insertps(auVar218,*(undefined4 *)(lVar6 + 0x3c + lVar12),0x20);
            in_XMM11 = insertps(auVar276,ZEXT416((uint)(fVar104 * fVar46)),0x30);
          }
          else if (iVar38 == 0x9244) {
            lVar6 = *plVar11;
            lVar12 = plVar11[2] * uVar15;
            in_XMM14 = *(undefined1 (*) [16])(lVar6 + lVar12);
            in_XMM11 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar12);
            local_f8 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar12);
            in_XMM9 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar12);
          }
          uVar47 = in_XMM14._0_4_;
          uVar79 = in_XMM14._4_4_;
          uVar80 = in_XMM14._8_4_;
          uVar81 = in_XMM14._12_4_;
          auVar185._4_4_ = uVar47;
          auVar185._0_4_ = uVar47;
          auVar185._8_4_ = uVar47;
          auVar185._12_4_ = uVar47;
          _local_218 = blendvps(_local_218,auVar185,auVar30);
          auVar115._4_4_ = uVar79;
          auVar115._0_4_ = uVar79;
          auVar115._8_4_ = uVar79;
          auVar115._12_4_ = uVar79;
          _local_278 = blendvps(_local_278,auVar115,auVar30);
          auVar116._4_4_ = uVar80;
          auVar116._0_4_ = uVar80;
          auVar116._8_4_ = uVar80;
          auVar116._12_4_ = uVar80;
          _local_238 = blendvps(_local_238,auVar116,auVar30);
          auVar117._4_4_ = uVar81;
          auVar117._0_4_ = uVar81;
          auVar117._8_4_ = uVar81;
          auVar117._12_4_ = uVar81;
          _local_1c8 = blendvps(_local_1c8,auVar117,auVar30);
          uVar47 = in_XMM11._0_4_;
          uVar79 = in_XMM11._4_4_;
          uVar80 = in_XMM11._8_4_;
          uVar81 = in_XMM11._12_4_;
          auVar118._4_4_ = uVar47;
          auVar118._0_4_ = uVar47;
          auVar118._8_4_ = uVar47;
          auVar118._12_4_ = uVar47;
          _local_258 = blendvps(_local_258,auVar118,auVar30);
          auVar119._4_4_ = uVar79;
          auVar119._0_4_ = uVar79;
          auVar119._8_4_ = uVar79;
          auVar119._12_4_ = uVar79;
          _local_1d8 = blendvps(_local_1d8,auVar119,auVar30);
          auVar120._4_4_ = uVar80;
          auVar120._0_4_ = uVar80;
          auVar120._8_4_ = uVar80;
          auVar120._12_4_ = uVar80;
          _local_228 = blendvps(_local_228,auVar120,auVar30);
          auVar121._4_4_ = uVar81;
          auVar121._0_4_ = uVar81;
          auVar121._8_4_ = uVar81;
          auVar121._12_4_ = uVar81;
          _local_208 = blendvps(_local_208,auVar121,auVar30);
          auVar122._4_4_ = local_f8._0_4_;
          auVar122._0_4_ = local_f8._0_4_;
          auVar122._8_4_ = local_f8._0_4_;
          auVar122._12_4_ = local_f8._0_4_;
          _local_248 = blendvps(_local_248,auVar122,auVar30);
          auVar123._4_4_ = local_f8._4_4_;
          auVar123._0_4_ = local_f8._4_4_;
          auVar123._8_4_ = local_f8._4_4_;
          auVar123._12_4_ = local_f8._4_4_;
          _local_1a8 = blendvps(_local_1a8,auVar123,auVar30);
          auVar124._4_4_ = local_f8._8_4_;
          auVar124._0_4_ = local_f8._8_4_;
          auVar124._8_4_ = local_f8._8_4_;
          auVar124._12_4_ = local_f8._8_4_;
          _local_1b8 = blendvps(_local_1b8,auVar124,auVar30);
          auVar125._4_4_ = local_f8._12_4_;
          auVar125._0_4_ = local_f8._12_4_;
          auVar125._8_4_ = local_f8._12_4_;
          auVar125._12_4_ = local_f8._12_4_;
          _local_1f8 = blendvps(_local_1f8,auVar125,auVar30);
          uVar47 = in_XMM9._0_4_;
          uVar79 = in_XMM9._4_4_;
          uVar80 = in_XMM9._8_4_;
          uVar81 = in_XMM9._12_4_;
          auVar126._4_4_ = uVar47;
          auVar126._0_4_ = uVar47;
          auVar126._8_4_ = uVar47;
          auVar126._12_4_ = uVar47;
          _local_188 = blendvps(_local_188,auVar126,auVar30);
          auVar127._4_4_ = uVar79;
          auVar127._0_4_ = uVar79;
          auVar127._8_4_ = uVar79;
          auVar127._12_4_ = uVar79;
          _local_198 = blendvps(_local_198,auVar127,auVar30);
          auVar128._4_4_ = uVar80;
          auVar128._0_4_ = uVar80;
          auVar128._8_4_ = uVar80;
          auVar128._12_4_ = uVar80;
          _local_108 = blendvps(_local_108,auVar128,auVar30);
          auVar129._4_4_ = uVar81;
          auVar129._0_4_ = uVar81;
          auVar129._8_4_ = uVar81;
          auVar129._12_4_ = uVar81;
          _local_148 = blendvps(_local_148,auVar129,auVar30);
          _local_288 = _local_288 ^ auVar30;
          iVar38 = (int)plVar11[0xb];
          if (iVar38 == 0x9134) {
            lVar6 = plVar11[7];
            plVar11 = (long *)(plVar11[9] * uVar15);
            auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + (long)plVar11)),
                                *(undefined4 *)(lVar6 + 0x10 + (long)plVar11),0x1c);
            in_XMM8 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x20 + (long)plVar11),0x28);
            auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 4 + (long)plVar11)),
                                *(undefined4 *)(lVar6 + 0x14 + (long)plVar11),0x1c);
            auVar272 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x24 + (long)plVar11),0x28);
            auVar159 = insertps(ZEXT416(*(uint *)(lVar6 + 8 + (long)plVar11)),
                                *(undefined4 *)(lVar6 + 0x18 + (long)plVar11),0x1c);
            auVar159 = insertps(auVar159,*(undefined4 *)(lVar6 + 0x28 + (long)plVar11),0x28);
            auVar276 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + (long)plVar11)),
                                *(undefined4 *)(lVar6 + 0x1c + (long)plVar11),0x1c);
            auVar167 = insertps(auVar276,*(undefined4 *)(lVar6 + 0x2c + (long)plVar11),0x28);
          }
          else if (iVar38 == 0x9234) {
            lVar6 = plVar11[7];
            plVar11 = (long *)(plVar11[9] * uVar15);
            uVar2 = *(undefined8 *)(lVar6 + 4 + (long)plVar11);
            in_XMM8._4_4_ = (int)uVar2;
            in_XMM8._0_4_ = *(undefined4 *)(lVar6 + (long)plVar11);
            in_XMM8._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM8._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x10 + (long)plVar11);
            auVar272._4_4_ = (int)uVar2;
            auVar272._0_4_ = (float)*(undefined4 *)(lVar6 + 0xc + (long)plVar11);
            auVar272._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar272._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x1c + (long)plVar11);
            auVar159._4_4_ = (int)uVar2;
            auVar159._0_4_ = *(undefined4 *)(lVar6 + 0x18 + (long)plVar11);
            auVar159._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar159._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x28 + (long)plVar11);
            auVar167._4_4_ = (int)uVar2;
            auVar167._0_4_ = *(undefined4 *)(lVar6 + 0x24 + (long)plVar11);
            auVar167._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar167._12_4_ = 0;
          }
          else if (iVar38 == 0xb001) {
            lVar6 = plVar11[7];
            plVar11 = (long *)(plVar11[9] * uVar15);
            auVar74._8_8_ = 0;
            auVar74._0_8_ = *(ulong *)(lVar6 + 0x10 + (long)plVar11);
            auVar272 = insertps(auVar74,*(undefined4 *)(lVar6 + 8 + (long)plVar11),0x20);
            uVar2 = *(undefined8 *)(lVar6 + 0x34 + (long)plVar11);
            auVar225._4_4_ = (int)uVar2;
            auVar225._0_4_ = *(undefined4 *)(lVar6 + (long)plVar11);
            auVar225._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar225._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x1c + (long)plVar11);
            auVar166._4_4_ = (int)uVar2;
            auVar166._0_4_ = *(undefined4 *)(lVar6 + 0x18 + (long)plVar11);
            auVar166._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar166._12_4_ = 0;
            fVar82 = *(float *)(lVar6 + 0x24 + (long)plVar11);
            fVar103 = *(float *)(lVar6 + 0x28 + (long)plVar11);
            fVar104 = *(float *)(lVar6 + 0x2c + (long)plVar11);
            fVar105 = *(float *)(lVar6 + 0x30 + (long)plVar11);
            fVar78 = fVar105 * fVar105 + fVar104 * fVar104 + fVar82 * fVar82 + fVar103 * fVar103;
            auVar159 = rsqrtss(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
            fVar46 = auVar159._0_4_;
            fVar46 = fVar46 * fVar46 * fVar78 * -0.5 * fVar46 + fVar46 * 1.5;
            auVar167 = insertps(auVar166,ZEXT416((uint)(fVar82 * fVar46)),0x30);
            in_XMM8 = insertps(auVar225,ZEXT416((uint)(fVar103 * fVar46)),0x30);
            auVar283._0_4_ = fVar46 * fVar105;
            auVar283._4_12_ = auVar159._4_12_;
            auVar276 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + (long)plVar11)),
                                *(undefined4 *)(lVar6 + 4 + (long)plVar11),0x10);
            auVar159 = insertps(auVar272,auVar283,0x30);
            auVar272 = insertps(auVar276,*(undefined4 *)(lVar6 + 0x3c + (long)plVar11),0x20);
            auVar272 = insertps(auVar272,ZEXT416((uint)(fVar104 * fVar46)),0x30);
          }
          else if (iVar38 == 0x9244) {
            lVar6 = plVar11[7];
            plVar11 = (long *)(plVar11[9] * uVar15);
            in_XMM8 = *(undefined1 (*) [16])(lVar6 + (long)plVar11);
            auVar272 = *(undefined1 (*) [16])(lVar6 + 0x10 + (long)plVar11);
            auVar159 = *(undefined1 (*) [16])(lVar6 + 0x20 + (long)plVar11);
            auVar167 = *(undefined1 (*) [16])(lVar6 + 0x30 + (long)plVar11);
          }
          uVar47 = in_XMM8._0_4_;
          uVar79 = in_XMM8._4_4_;
          uVar80 = in_XMM8._8_4_;
          uVar81 = in_XMM8._12_4_;
          auVar186._4_4_ = uVar47;
          auVar186._0_4_ = uVar47;
          auVar186._8_4_ = uVar47;
          auVar186._12_4_ = uVar47;
          _local_b8 = blendvps(_local_b8,auVar186,auVar30);
          auVar130._4_4_ = uVar79;
          auVar130._0_4_ = uVar79;
          auVar130._8_4_ = uVar79;
          auVar130._12_4_ = uVar79;
          _local_a8 = blendvps(_local_a8,auVar130,auVar30);
          auVar131._4_4_ = uVar80;
          auVar131._0_4_ = uVar80;
          auVar131._8_4_ = uVar80;
          auVar131._12_4_ = uVar80;
          _local_98 = blendvps(_local_98,auVar131,auVar30);
          auVar132._4_4_ = uVar81;
          auVar132._0_4_ = uVar81;
          auVar132._8_4_ = uVar81;
          auVar132._12_4_ = uVar81;
          _local_178 = blendvps(_local_178,auVar132,auVar30);
          uVar47 = auVar272._0_4_;
          uVar79 = auVar272._4_4_;
          uVar80 = auVar272._8_4_;
          uVar81 = auVar272._12_4_;
          auVar133._4_4_ = uVar47;
          auVar133._0_4_ = uVar47;
          auVar133._8_4_ = uVar47;
          auVar133._12_4_ = uVar47;
          _local_88 = blendvps(_local_88,auVar133,auVar30);
          auVar134._4_4_ = uVar79;
          auVar134._0_4_ = uVar79;
          auVar134._8_4_ = uVar79;
          auVar134._12_4_ = uVar79;
          _local_78 = blendvps(_local_78,auVar134,auVar30);
          auVar135._4_4_ = uVar80;
          auVar135._0_4_ = uVar80;
          auVar135._8_4_ = uVar80;
          auVar135._12_4_ = uVar80;
          _local_68 = blendvps(_local_68,auVar135,auVar30);
          auVar136._4_4_ = uVar81;
          auVar136._0_4_ = uVar81;
          auVar136._8_4_ = uVar81;
          auVar136._12_4_ = uVar81;
          _local_1e8 = blendvps(_local_1e8,auVar136,auVar30);
          uVar47 = auVar159._0_4_;
          uVar79 = auVar159._4_4_;
          uVar80 = auVar159._8_4_;
          uVar81 = auVar159._12_4_;
          auVar137._4_4_ = uVar47;
          auVar137._0_4_ = uVar47;
          auVar137._8_4_ = uVar47;
          auVar137._12_4_ = uVar47;
          _local_d8 = blendvps(_local_d8,auVar137,auVar30);
          auVar138._4_4_ = uVar79;
          auVar138._0_4_ = uVar79;
          auVar138._8_4_ = uVar79;
          auVar138._12_4_ = uVar79;
          _local_168 = blendvps(_local_168,auVar138,auVar30);
          auVar139._4_4_ = uVar80;
          auVar139._0_4_ = uVar80;
          auVar139._8_4_ = uVar80;
          auVar139._12_4_ = uVar80;
          _local_158 = blendvps(_local_158,auVar139,auVar30);
          auVar140._4_4_ = uVar81;
          auVar140._0_4_ = uVar81;
          auVar140._8_4_ = uVar81;
          auVar140._12_4_ = uVar81;
          _local_268 = blendvps(_local_268,auVar140,auVar30);
          uVar47 = auVar167._0_4_;
          uVar79 = auVar167._4_4_;
          uVar80 = auVar167._8_4_;
          uVar81 = auVar167._12_4_;
          auVar141._4_4_ = uVar47;
          auVar141._0_4_ = uVar47;
          auVar141._8_4_ = uVar47;
          auVar141._12_4_ = uVar47;
          _local_138 = blendvps(_local_138,auVar141,auVar30);
          auVar142._4_4_ = uVar79;
          auVar142._0_4_ = uVar79;
          auVar142._8_4_ = uVar79;
          auVar142._12_4_ = uVar79;
          _local_128 = blendvps(_local_128,auVar142,auVar30);
          auVar143._4_4_ = uVar80;
          auVar143._0_4_ = uVar80;
          auVar143._8_4_ = uVar80;
          auVar143._12_4_ = uVar80;
          _local_118 = blendvps(_local_118,auVar143,auVar30);
          auVar144._4_4_ = uVar81;
          auVar144._0_4_ = uVar81;
          auVar144._8_4_ = uVar81;
          auVar144._12_4_ = uVar81;
          local_e8 = blendvps(local_e8,auVar144,auVar30);
          uVar10 = movmskps((int)plVar11,_local_288);
        } while (uVar10 != 0);
        auVar168._0_4_ =
             local_268._0_4_ * (float)local_1f8._0_4_ +
             local_1e8._0_4_ * (float)local_208._0_4_ +
             local_178._0_4_ * (float)local_1c8._0_4_ + local_e8._0_4_ * (float)local_148._0_4_;
        auVar168._4_4_ =
             local_268._4_4_ * (float)local_1f8._4_4_ +
             local_1e8._4_4_ * (float)local_208._4_4_ +
             local_178._4_4_ * (float)local_1c8._4_4_ + local_e8._4_4_ * (float)local_148._4_4_;
        auVar168._8_4_ =
             local_268._8_4_ * fStack_1f0 +
             local_1e8._8_4_ * fStack_200 +
             local_178._8_4_ * fStack_1c0 + local_e8._8_4_ * fStack_140;
        auVar168._12_4_ =
             local_268._12_4_ * fStack_1ec +
             local_1e8._12_4_ * fStack_1fc +
             local_178._12_4_ * fStack_1bc + local_e8._12_4_ * fStack_13c;
        uVar15 = CONCAT44(auVar168._4_4_,auVar168._0_4_);
        auVar237._0_8_ = uVar15 ^ 0x8000000080000000;
        auVar237._8_4_ = -auVar168._8_4_;
        auVar237._12_4_ = -auVar168._12_4_;
        auVar31._4_4_ = -(uint)(auVar168._4_4_ < -auVar168._4_4_);
        auVar31._0_4_ = -(uint)(auVar168._0_4_ < -auVar168._0_4_);
        auVar31._8_4_ = -(uint)(auVar168._8_4_ < auVar237._8_4_);
        auVar31._12_4_ = -(uint)(auVar168._12_4_ < auVar237._12_4_);
        auVar95._0_8_ = local_e8._0_8_ ^ 0x8000000080000000;
        auVar95._8_4_ = -local_e8._8_4_;
        auVar95._12_4_ = -local_e8._12_4_;
        auVar298 = blendvps(local_e8,auVar95,auVar31);
        auVar96._0_8_ = local_178 ^ 0x8000000080000000;
        auVar96._8_4_ = -local_178._8_4_;
        auVar96._12_4_ = -local_178._12_4_;
        auVar19 = blendvps(_local_178,auVar96,auVar31);
        auVar97._0_8_ = local_1e8 ^ 0x8000000080000000;
        auVar97._8_4_ = -local_1e8._8_4_;
        auVar97._12_4_ = -local_1e8._12_4_;
        auVar276 = blendvps(_local_1e8,auVar97,auVar31);
        auVar98._0_8_ = local_268 ^ 0x8000000080000000;
        auVar98._8_4_ = -local_268._8_4_;
        auVar98._12_4_ = -local_268._12_4_;
        auVar159 = blendvps(_local_268,auVar98,auVar31);
        auVar218 = maxps(auVar237,auVar168);
        fVar82 = ABS(auVar168._0_4_);
        fVar103 = ABS(auVar168._4_4_);
        uVar15 = CONCAT44(auVar168._4_4_,auVar168._0_4_);
        auVar169._0_8_ = uVar15 & 0x7fffffff7fffffff;
        auVar169._8_4_ = ABS(auVar168._8_4_);
        auVar169._12_4_ = ABS(auVar168._12_4_);
        auVar99._0_4_ = 1.0 - fVar82;
        auVar99._4_4_ = 1.0 - fVar103;
        auVar99._8_4_ = 1.0 - auVar169._8_4_;
        auVar99._12_4_ = 1.0 - auVar169._12_4_;
        auVar272 = sqrtps(auVar99,auVar99);
        auVar32._0_4_ =
             1.5707964 -
             auVar272._0_4_ *
             (((((fVar82 * -0.0043095737 + 0.0192803) * fVar82 + -0.04489909) * fVar82 + 0.08785567)
               * fVar82 + -0.21450998) * fVar82 + 1.5707952);
        auVar32._4_4_ =
             1.5707964 -
             auVar272._4_4_ *
             (((((fVar103 * -0.0043095737 + 0.0192803) * fVar103 + -0.04489909) * fVar103 +
               0.08785567) * fVar103 + -0.21450998) * fVar103 + 1.5707952);
        auVar32._8_4_ =
             1.5707964 -
             auVar272._8_4_ *
             (((((auVar169._8_4_ * -0.0043095737 + 0.0192803) * auVar169._8_4_ + -0.04489909) *
                auVar169._8_4_ + 0.08785567) * auVar169._8_4_ + -0.21450998) * auVar169._8_4_ +
             1.5707952);
        auVar32._12_4_ =
             1.5707964 -
             auVar272._12_4_ *
             (((((auVar169._12_4_ * -0.0043095737 + 0.0192803) * auVar169._12_4_ + -0.04489909) *
                auVar169._12_4_ + 0.08785567) * auVar169._12_4_ + -0.21450998) * auVar169._12_4_ +
             1.5707952);
        auVar272 = maxps(ZEXT816(0),auVar32);
        fVar191 = auVar218._0_4_;
        fVar197 = auVar218._4_4_;
        fVar198 = auVar218._8_4_;
        fVar199 = auVar218._12_4_;
        auVar33._4_4_ = -(uint)(fVar197 < 0.0);
        auVar33._0_4_ = -(uint)(fVar191 < 0.0);
        auVar33._8_4_ = -(uint)(fVar198 < 0.0);
        auVar33._12_4_ = -(uint)(fVar199 < 0.0);
        auVar100._0_8_ = auVar272._0_8_ ^ 0x8000000080000000;
        auVar100._8_4_ = auVar272._8_4_ ^ 0x80000000;
        auVar100._12_4_ = auVar272._12_4_ ^ 0x80000000;
        auVar272 = blendvps(auVar272,auVar100,auVar33);
        auVar101._0_4_ = 1.5707964 - auVar272._0_4_;
        auVar101._4_4_ = 1.5707964 - auVar272._4_4_;
        auVar101._8_4_ = 1.5707964 - auVar272._8_4_;
        auVar101._12_4_ = 1.5707964 - auVar272._12_4_;
        auVar34._4_4_ = -(uint)(1.0 < fVar103);
        auVar34._0_4_ = -(uint)(1.0 < fVar82);
        auVar34._8_4_ = -(uint)(1.0 < auVar169._8_4_);
        auVar34._12_4_ = -(uint)(1.0 < auVar169._12_4_);
        auVar272 = blendvps(auVar101,_DAT_01f80c30,auVar34);
        fVar82 = auVar272._0_4_ * auVar317._0_4_;
        fVar103 = auVar272._4_4_ * auVar317._4_4_;
        fVar104 = auVar272._8_4_ * auVar317._8_4_;
        fVar105 = auVar272._12_4_ * auVar317._12_4_;
        auVar35._0_4_ = fVar82 * 0.63661975;
        auVar35._4_4_ = fVar103 * 0.63661975;
        auVar35._8_4_ = fVar104 * 0.63661975;
        auVar35._12_4_ = fVar105 * 0.63661975;
        auVar272 = roundps(auVar169,auVar35,1);
        uVar14 = (uint)auVar272._0_4_;
        uVar10 = (uint)auVar272._4_4_;
        uVar40 = (uint)auVar272._8_4_;
        uVar44 = (uint)auVar272._12_4_;
        fVar82 = fVar82 - auVar272._0_4_ * 1.5707964;
        fVar103 = fVar103 - auVar272._4_4_ * 1.5707964;
        fVar104 = fVar104 - auVar272._8_4_ * 1.5707964;
        fVar105 = fVar105 - auVar272._12_4_ * 1.5707964;
        uVar39 = uVar14 & 3;
        uVar43 = uVar10 & 3;
        uVar41 = uVar40 & 3;
        uVar45 = uVar44 & 3;
        fVar46 = fVar82 * fVar82;
        fVar78 = fVar103 * fVar103;
        fVar190 = fVar104 * fVar104;
        fVar245 = fVar105 * fVar105;
        uVar14 = uVar14 & 1;
        uVar10 = uVar10 & 1;
        uVar40 = uVar40 & 1;
        uVar44 = uVar44 & 1;
        auVar145._0_4_ = -(uint)(uVar14 == 0);
        auVar145._4_4_ = -(uint)(uVar10 == 0);
        auVar145._8_4_ = -(uint)(uVar40 == 0);
        auVar145._12_4_ = -(uint)(uVar44 == 0);
        auVar211._4_4_ = -uVar10;
        auVar211._0_4_ = -uVar14;
        auVar211._8_4_ = -uVar40;
        auVar211._12_4_ = -uVar44;
        auVar284._0_8_ =
             CONCAT44((((((fVar78 * -2.5029328e-08 + 2.7600126e-06) * fVar78 + -0.00019842605) *
                         fVar78 + 0.008333348) * fVar78 + -0.16666667) * fVar78 + 1.0) * fVar103,
                      (((((fVar46 * -2.5029328e-08 + 2.7600126e-06) * fVar46 + -0.00019842605) *
                         fVar46 + 0.008333348) * fVar46 + -0.16666667) * fVar46 + 1.0) * fVar82);
        auVar284._8_4_ =
             (((((fVar190 * -2.5029328e-08 + 2.7600126e-06) * fVar190 + -0.00019842605) * fVar190 +
               0.008333348) * fVar190 + -0.16666667) * fVar190 + 1.0) * fVar104;
        auVar284._12_4_ =
             (((((fVar245 * -2.5029328e-08 + 2.7600126e-06) * fVar245 + -0.00019842605) * fVar245 +
               0.008333348) * fVar245 + -0.16666667) * fVar245 + 1.0) * fVar105;
        auVar187._0_4_ =
             ((((fVar46 * -2.5963018e-07 + 2.4756235e-05) * fVar46 + -0.001388833) * fVar46 +
              0.04166664) * fVar46 + -0.5) * fVar46 + 1.0;
        auVar187._4_4_ =
             ((((fVar78 * -2.5963018e-07 + 2.4756235e-05) * fVar78 + -0.001388833) * fVar78 +
              0.04166664) * fVar78 + -0.5) * fVar78 + 1.0;
        auVar187._8_4_ =
             ((((fVar190 * -2.5963018e-07 + 2.4756235e-05) * fVar190 + -0.001388833) * fVar190 +
              0.04166664) * fVar190 + -0.5) * fVar190 + 1.0;
        auVar187._12_4_ =
             ((((fVar245 * -2.5963018e-07 + 2.4756235e-05) * fVar245 + -0.001388833) * fVar245 +
              0.04166664) * fVar245 + -0.5) * fVar245 + 1.0;
        auVar291._8_4_ = auVar284._8_4_;
        auVar291._0_8_ = auVar284._0_8_;
        auVar291._12_4_ = auVar284._12_4_;
        auVar218 = blendvps(auVar291,auVar187,auVar211);
        auVar272 = blendvps(auVar284,auVar187,auVar145);
        auVar36._0_4_ = -(uint)(1 < uVar39);
        auVar36._4_4_ = -(uint)(1 < uVar43);
        auVar36._8_4_ = -(uint)(1 < uVar41);
        auVar36._12_4_ = -(uint)(1 < uVar45);
        auVar146._0_8_ = auVar218._0_8_ ^ 0x8000000080000000;
        auVar146._8_4_ = auVar218._8_4_ ^ 0x80000000;
        auVar146._12_4_ = auVar218._12_4_ ^ 0x80000000;
        auVar262 = blendvps(auVar218,auVar146,auVar36);
        uVar39 = uVar39 - 1;
        uVar43 = uVar43 - 1;
        uVar41 = uVar41 - 1;
        uVar45 = uVar45 - 1;
        auVar226._0_4_ = -(uint)(((uVar39 == 0) * uVar39 | (uint)(uVar39 != 0)) == uVar39);
        auVar226._4_4_ = -(uint)(((uVar43 == 0) * uVar43 | (uint)(uVar43 != 0)) == uVar43);
        auVar226._8_4_ = -(uint)(((uVar41 == 0) * uVar41 | (uint)(uVar41 != 0)) == uVar41);
        auVar226._12_4_ = -(uint)(((uVar45 == 0) * uVar45 | (uint)(uVar45 != 0)) == uVar45);
        auVar75._0_8_ = auVar272._0_8_ ^ 0x8000000080000000;
        auVar75._8_4_ = auVar272._8_4_ ^ 0x80000000;
        auVar75._12_4_ = auVar272._12_4_ ^ 0x80000000;
        auVar218 = blendvps(auVar272,auVar75,auVar226);
        fVar46 = (float)local_148._0_4_ * fVar191 - auVar298._0_4_;
        fVar78 = (float)local_148._4_4_ * fVar197 - auVar298._4_4_;
        fVar190 = fStack_140 * fVar198 - auVar298._8_4_;
        fVar245 = fStack_13c * fVar199 - auVar298._12_4_;
        fVar149 = (float)local_1c8._0_4_ * fVar191 - auVar19._0_4_;
        fVar150 = (float)local_1c8._4_4_ * fVar197 - auVar19._4_4_;
        fVar151 = fStack_1c0 * fVar198 - auVar19._8_4_;
        fVar152 = fStack_1bc * fVar199 - auVar19._12_4_;
        local_1e8._0_4_ = auVar276._0_4_;
        local_1e8._4_4_ = auVar276._4_4_;
        fStack_1e0 = auVar276._8_4_;
        fStack_1dc = auVar276._12_4_;
        fVar153 = (float)local_208._0_4_ * fVar191 - (float)local_1e8._0_4_;
        fVar155 = (float)local_208._4_4_ * fVar197 - (float)local_1e8._4_4_;
        fVar156 = fStack_200 * fVar198 - fStack_1e0;
        fVar170 = fStack_1fc * fVar199 - fStack_1dc;
        local_268._0_4_ = auVar159._0_4_;
        local_268._4_4_ = auVar159._4_4_;
        uStack_260._0_4_ = auVar159._8_4_;
        uStack_260._4_4_ = auVar159._12_4_;
        fVar243 = (float)local_1f8._0_4_ * fVar191 - (float)local_268._0_4_;
        fVar244 = (float)local_1f8._4_4_ * fVar197 - (float)local_268._4_4_;
        fVar255 = fStack_1f0 * fVar198 - (float)uStack_260;
        fVar256 = fStack_1ec * fVar199 - uStack_260._4_4_;
        auVar76._0_4_ = fVar243 * fVar243 + fVar153 * fVar153 + fVar149 * fVar149 + fVar46 * fVar46;
        auVar76._4_4_ = fVar244 * fVar244 + fVar155 * fVar155 + fVar150 * fVar150 + fVar78 * fVar78;
        auVar76._8_4_ =
             fVar255 * fVar255 + fVar156 * fVar156 + fVar151 * fVar151 + fVar190 * fVar190;
        auVar76._12_4_ =
             fVar256 * fVar256 + fVar170 * fVar170 + fVar152 * fVar152 + fVar245 * fVar245;
        auVar272 = rsqrtps(auVar146,auVar76);
        fVar82 = auVar272._0_4_;
        fVar103 = auVar272._4_4_;
        fVar104 = auVar272._8_4_;
        fVar105 = auVar272._12_4_;
        fVar176 = fVar82 * 1.5 - fVar82 * fVar82 * auVar76._0_4_ * 0.5 * fVar82;
        fVar178 = fVar103 * 1.5 - fVar103 * fVar103 * auVar76._4_4_ * 0.5 * fVar103;
        fVar188 = fVar104 * 1.5 - fVar104 * fVar104 * auVar76._8_4_ * 0.5 * fVar104;
        fVar189 = fVar105 * 1.5 - fVar105 * fVar105 * auVar76._12_4_ * 0.5 * fVar105;
        fVar227 = auVar262._0_4_;
        fVar228 = auVar262._4_4_;
        fVar239 = auVar262._8_4_;
        fVar240 = auVar262._12_4_;
        fVar200 = auVar218._0_4_;
        fVar213 = auVar218._4_4_;
        fVar214 = auVar218._8_4_;
        fVar215 = auVar218._12_4_;
        local_288._4_4_ = (float)local_148._4_4_ * fVar213 - fVar78 * fVar178 * fVar228;
        local_288._0_4_ = (float)local_148._0_4_ * fVar200 - fVar46 * fVar176 * fVar227;
        uStack_280._0_4_ = fStack_140 * fVar214 - fVar190 * fVar188 * fVar239;
        uStack_280._4_4_ = fStack_13c * fVar215 - fVar245 * fVar189 * fVar240;
        fVar241 = (auVar298._0_4_ - (float)local_148._0_4_) * auVar317._0_4_ +
                  (float)local_148._0_4_;
        fVar242 = (auVar298._4_4_ - (float)local_148._4_4_) * auVar317._4_4_ +
                  (float)local_148._4_4_;
        fStack_140 = (auVar298._8_4_ - fStack_140) * auVar317._8_4_ + fStack_140;
        fStack_13c = (auVar298._12_4_ - fStack_13c) * auVar317._12_4_ + fStack_13c;
        fVar46 = (auVar19._0_4_ - (float)local_1c8._0_4_) * auVar317._0_4_ + (float)local_1c8._0_4_;
        fVar78 = (auVar19._4_4_ - (float)local_1c8._4_4_) * auVar317._4_4_ + (float)local_1c8._4_4_;
        fVar190 = (auVar19._8_4_ - fStack_1c0) * auVar317._8_4_ + fStack_1c0;
        fVar245 = (auVar19._12_4_ - fStack_1bc) * auVar317._12_4_ + fStack_1bc;
        fVar171 = ((float)local_1e8._0_4_ - (float)local_208._0_4_) * auVar317._0_4_ +
                  (float)local_208._0_4_;
        fVar172 = ((float)local_1e8._4_4_ - (float)local_208._4_4_) * auVar317._4_4_ +
                  (float)local_208._4_4_;
        fVar173 = (fStack_1e0 - fStack_200) * auVar317._8_4_ + fStack_200;
        fVar175 = (fStack_1dc - fStack_1fc) * auVar317._12_4_ + fStack_1fc;
        auVar147._0_4_ = fVar171 * fVar171 + fVar46 * fVar46 + fVar241 * fVar241;
        auVar147._4_4_ = fVar172 * fVar172 + fVar78 * fVar78 + fVar242 * fVar242;
        auVar147._8_4_ = fVar173 * fVar173 + fVar190 * fVar190 + fStack_140 * fStack_140;
        auVar147._12_4_ = fVar175 * fVar175 + fVar245 * fVar245 + fStack_13c * fStack_13c;
        fVar82 = ((float)local_268._0_4_ - (float)local_1f8._0_4_) * auVar317._0_4_ +
                 (float)local_1f8._0_4_;
        fVar103 = ((float)local_268._4_4_ - (float)local_1f8._4_4_) * auVar317._4_4_ +
                  (float)local_1f8._4_4_;
        fVar104 = ((float)uStack_260 - fStack_1f0) * auVar317._8_4_ + fStack_1f0;
        fVar105 = (uStack_260._4_4_ - fStack_1ec) * auVar317._12_4_ + fStack_1ec;
        auVar77._0_4_ = fVar82 * fVar82 + auVar147._0_4_;
        auVar77._4_4_ = fVar103 * fVar103 + auVar147._4_4_;
        auVar77._8_4_ = fVar104 * fVar104 + auVar147._8_4_;
        auVar77._12_4_ = fVar105 * fVar105 + auVar147._12_4_;
        auVar272 = rsqrtps(auVar147,auVar77);
        fVar192 = auVar272._0_4_;
        fVar107 = auVar272._4_4_;
        fVar154 = auVar272._8_4_;
        fVar106 = auVar272._12_4_;
        fVar192 = fVar192 * 1.5 - fVar192 * fVar192 * auVar77._0_4_ * 0.5 * fVar192;
        fVar107 = fVar107 * 1.5 - fVar107 * fVar107 * auVar77._4_4_ * 0.5 * fVar107;
        fVar154 = fVar154 * 1.5 - fVar154 * fVar154 * auVar77._8_4_ * 0.5 * fVar154;
        fVar106 = fVar106 * 1.5 - fVar106 * fVar106 * auVar77._12_4_ * 0.5 * fVar106;
        auVar306._0_4_ = fVar241 * fVar192;
        auVar306._4_4_ = fVar242 * fVar107;
        auVar306._8_4_ = fStack_140 * fVar154;
        auVar306._12_4_ = fStack_13c * fVar106;
        auVar37._4_4_ = -(uint)(0.9995 < fVar197);
        auVar37._0_4_ = -(uint)(0.9995 < fVar191);
        auVar37._8_4_ = -(uint)(0.9995 < fVar198);
        auVar37._12_4_ = -(uint)(0.9995 < fVar199);
        auVar272 = blendvps(_local_288,auVar306,auVar37);
        auVar196._0_4_ = (float)local_1c8._0_4_ * fVar200 - fVar149 * fVar176 * fVar227;
        auVar196._4_4_ = (float)local_1c8._4_4_ * fVar213 - fVar150 * fVar178 * fVar228;
        auVar196._8_4_ = fStack_1c0 * fVar214 - fVar151 * fVar188 * fVar239;
        auVar196._12_4_ = fStack_1bc * fVar215 - fVar152 * fVar189 * fVar240;
        auVar102._0_4_ = fVar46 * fVar192;
        auVar102._4_4_ = fVar78 * fVar107;
        auVar102._8_4_ = fVar190 * fVar154;
        auVar102._12_4_ = fVar245 * fVar106;
        auVar276 = blendvps(auVar196,auVar102,auVar37);
        auVar148._0_4_ = (float)local_208._0_4_ * fVar200 - fVar153 * fVar176 * fVar227;
        auVar148._4_4_ = (float)local_208._4_4_ * fVar213 - fVar155 * fVar178 * fVar228;
        auVar148._8_4_ = fStack_200 * fVar214 - fVar156 * fVar188 * fVar239;
        auVar148._12_4_ = fStack_1fc * fVar215 - fVar170 * fVar189 * fVar240;
        auVar212._0_4_ = fVar171 * fVar192;
        auVar212._4_4_ = fVar172 * fVar107;
        auVar212._8_4_ = fVar173 * fVar154;
        auVar212._12_4_ = fVar175 * fVar106;
        auVar159 = blendvps(auVar148,auVar212,auVar37);
        auVar285._0_4_ = fVar200 * (float)local_1f8._0_4_ - fVar176 * fVar243 * fVar227;
        auVar285._4_4_ = fVar213 * (float)local_1f8._4_4_ - fVar178 * fVar244 * fVar228;
        auVar285._8_4_ = fVar214 * fStack_1f0 - fVar188 * fVar255 * fVar239;
        auVar285._12_4_ = fVar215 * fStack_1ec - fVar189 * fVar256 * fVar240;
        auVar238._0_4_ = fVar192 * fVar82;
        auVar238._4_4_ = fVar107 * fVar103;
        auVar238._8_4_ = fVar154 * fVar104;
        auVar238._12_4_ = fVar106 * fVar105;
        auVar218 = blendvps(auVar285,auVar238,auVar37);
        fVar82 = 1.0 - auVar317._0_4_;
        fVar103 = 1.0 - auVar317._4_4_;
        fVar104 = 1.0 - auVar317._8_4_;
        fVar105 = 1.0 - auVar317._12_4_;
        local_218._4_4_ = (float)local_218._4_4_ * fVar103 + (float)local_b8._4_4_ * auVar317._4_4_;
        local_218._0_4_ = (float)local_218._0_4_ * fVar82 + (float)local_b8._0_4_ * auVar317._0_4_;
        uStack_210._0_4_ = (float)uStack_210 * fVar104 + fStack_b0 * auVar317._8_4_;
        uStack_210._4_4_ = uStack_210._4_4_ * fVar105 + fStack_ac * auVar317._12_4_;
        local_278._4_4_ = (float)local_278._4_4_ * fVar103 + (float)local_a8._4_4_ * auVar317._4_4_;
        local_278._0_4_ = (float)local_278._0_4_ * fVar82 + (float)local_a8._0_4_ * auVar317._0_4_;
        uStack_270._0_4_ = (float)uStack_270 * fVar104 + fStack_a0 * auVar317._8_4_;
        uStack_270._4_4_ = uStack_270._4_4_ * fVar105 + fStack_9c * auVar317._12_4_;
        local_238._4_4_ = (float)local_238._4_4_ * fVar103 + (float)local_98._4_4_ * auVar317._4_4_;
        local_238._0_4_ = (float)local_238._0_4_ * fVar82 + (float)local_98._0_4_ * auVar317._0_4_;
        uStack_230._0_4_ = (float)uStack_230 * fVar104 + fStack_90 * auVar317._8_4_;
        uStack_230._4_4_ = uStack_230._4_4_ * fVar105 + fStack_8c * auVar317._12_4_;
        local_258._4_4_ = (float)local_258._4_4_ * fVar103 + (float)local_88._4_4_ * auVar317._4_4_;
        local_258._0_4_ = (float)local_258._0_4_ * fVar82 + (float)local_88._0_4_ * auVar317._0_4_;
        fStack_250 = fStack_250 * fVar104 + fStack_80 * auVar317._8_4_;
        fStack_24c = fStack_24c * fVar105 + fStack_7c * auVar317._12_4_;
        local_1d8._4_4_ = (float)local_1d8._4_4_ * fVar103 + (float)local_78._4_4_ * auVar317._4_4_;
        local_1d8._0_4_ = (float)local_1d8._0_4_ * fVar82 + (float)local_78._0_4_ * auVar317._0_4_;
        fStack_1d0 = fStack_1d0 * fVar104 + fStack_70 * auVar317._8_4_;
        fStack_1cc = fStack_1cc * fVar105 + fStack_6c * auVar317._12_4_;
        local_228._4_4_ = (float)local_228._4_4_ * fVar103 + (float)local_68._4_4_ * auVar317._4_4_;
        local_228._0_4_ = (float)local_228._0_4_ * fVar82 + (float)local_68._0_4_ * auVar317._0_4_;
        uStack_220._0_4_ = (float)uStack_220 * fVar104 + fStack_60 * auVar317._8_4_;
        uStack_220._4_4_ = uStack_220._4_4_ * fVar105 + fStack_5c * auVar317._12_4_;
        local_248._4_4_ = (float)local_248._4_4_ * fVar103 + (float)local_d8._4_4_ * auVar317._4_4_;
        local_248._0_4_ = (float)local_248._0_4_ * fVar82 + (float)local_d8._0_4_ * auVar317._0_4_;
        fStack_240 = fStack_240 * fVar104 + fStack_d0 * auVar317._8_4_;
        fStack_23c = fStack_23c * fVar105 + fStack_cc * auVar317._12_4_;
        local_1a8._4_4_ = (float)local_1a8._4_4_ * fVar103 + (float)local_168._4_4_ * auVar317._4_4_
        ;
        local_1a8._0_4_ = (float)local_1a8._0_4_ * fVar82 + (float)local_168._0_4_ * auVar317._0_4_;
        fStack_1a0 = fStack_1a0 * fVar104 + fStack_160 * auVar317._8_4_;
        fStack_19c = fStack_19c * fVar105 + fStack_15c * auVar317._12_4_;
        local_1b8._4_4_ = (float)local_1b8._4_4_ * fVar103 + (float)local_158._4_4_ * auVar317._4_4_
        ;
        local_1b8._0_4_ = (float)local_1b8._0_4_ * fVar82 + (float)local_158._0_4_ * auVar317._0_4_;
        fStack_1b0 = fStack_1b0 * fVar104 + fStack_150 * auVar317._8_4_;
        fStack_1ac = fStack_1ac * fVar105 + fStack_14c * auVar317._12_4_;
        local_188._4_4_ = (float)local_188._4_4_ * fVar103 + (float)local_138._4_4_ * auVar317._4_4_
        ;
        local_188._0_4_ = (float)local_188._0_4_ * fVar82 + (float)local_138._0_4_ * auVar317._0_4_;
        fStack_180 = fStack_180 * fVar104 + fStack_130 * auVar317._8_4_;
        fStack_17c = fStack_17c * fVar105 + fStack_12c * auVar317._12_4_;
        local_198._4_4_ = (float)local_198._4_4_ * fVar103 + (float)local_128._4_4_ * auVar317._4_4_
        ;
        local_198._0_4_ = (float)local_198._0_4_ * fVar82 + (float)local_128._0_4_ * auVar317._0_4_;
        fStack_190 = fStack_190 * fVar104 + fStack_120 * auVar317._8_4_;
        fStack_18c = fStack_18c * fVar105 + fStack_11c * auVar317._12_4_;
        local_268._4_4_ = fVar103 * (float)local_108._4_4_ + (float)local_118._4_4_ * auVar317._4_4_
        ;
        local_268._0_4_ = fVar82 * (float)local_108._0_4_ + (float)local_118._0_4_ * auVar317._0_4_;
        uStack_260._0_4_ = fVar104 * fStack_100 + fStack_110 * auVar317._8_4_;
        uStack_260._4_4_ = fVar105 * fStack_fc + fStack_10c * auVar317._12_4_;
        fVar176 = auVar276._0_4_;
        fVar178 = auVar276._4_4_;
        fVar189 = auVar276._12_4_;
        local_288._0_4_ = auVar272._0_4_;
        local_288._4_4_ = auVar272._4_4_;
        uStack_280._0_4_ = auVar272._8_4_;
        uStack_280._4_4_ = auVar272._12_4_;
        fVar188 = auVar276._8_4_;
        fVar107 = auVar159._0_4_;
        fVar106 = auVar159._4_4_;
        fVar150 = auVar159._8_4_;
        fVar152 = auVar159._12_4_;
        fVar227 = auVar218._0_4_;
        fVar228 = auVar218._4_4_;
        fVar239 = auVar218._8_4_;
        fVar240 = auVar218._12_4_;
        fVar82 = fVar176 * fVar107 + (float)local_288._0_4_ * fVar227;
        fVar103 = fVar178 * fVar106 + (float)local_288._4_4_ * fVar228;
        fVar104 = fVar188 * fVar150 + (float)uStack_280 * fVar239;
        fVar105 = fVar189 * fVar152 + uStack_280._4_4_ * fVar240;
        fVar241 = fVar176 * fVar107 - (float)local_288._0_4_ * fVar227;
        fVar242 = fVar178 * fVar106 - (float)local_288._4_4_ * fVar228;
        fVar243 = fVar188 * fVar150 - (float)uStack_280 * fVar239;
        fVar244 = fVar189 * fVar152 - uStack_280._4_4_ * fVar240;
        fVar200 = fVar107 * fVar107;
        fVar213 = fVar106 * fVar106;
        fVar214 = fVar150 * fVar150;
        fVar215 = fVar152 * fVar152;
        fVar171 = ((float)local_288._0_4_ * (float)local_288._0_4_ + fVar176 * fVar176) - fVar200;
        fVar172 = ((float)local_288._4_4_ * (float)local_288._4_4_ + fVar178 * fVar178) - fVar213;
        fVar173 = ((float)uStack_280 * (float)uStack_280 + fVar188 * fVar188) - fVar214;
        fVar175 = (uStack_280._4_4_ * uStack_280._4_4_ + fVar189 * fVar189) - fVar215;
        fVar46 = (float)local_288._0_4_ * (float)local_288._0_4_ - fVar176 * fVar176;
        fVar78 = (float)local_288._4_4_ * (float)local_288._4_4_ - fVar178 * fVar178;
        fVar190 = (float)uStack_280 * (float)uStack_280 - fVar188 * fVar188;
        fVar245 = uStack_280._4_4_ * uStack_280._4_4_ - fVar189 * fVar189;
        fVar192 = fVar176 * fVar227 - (float)local_288._0_4_ * fVar107;
        fVar154 = fVar178 * fVar228 - (float)local_288._4_4_ * fVar106;
        fVar149 = fVar188 * fVar239 - (float)uStack_280 * fVar150;
        fVar151 = fVar189 * fVar240 - uStack_280._4_4_ * fVar152;
        fVar153 = (float)local_288._0_4_ * fVar107 + fVar176 * fVar227;
        fVar155 = (float)local_288._4_4_ * fVar106 + fVar178 * fVar228;
        fVar156 = (float)uStack_280 * fVar150 + fVar188 * fVar239;
        fVar170 = uStack_280._4_4_ * fVar152 + fVar189 * fVar240;
        fVar191 = fVar227 * fVar107 + fVar176 * (float)local_288._0_4_;
        fVar197 = fVar228 * fVar106 + fVar178 * (float)local_288._4_4_;
        fVar198 = fVar239 * fVar150 + fVar188 * (float)uStack_280;
        fVar199 = fVar240 * fVar152 + fVar189 * uStack_280._4_4_;
        fVar107 = fVar227 * fVar107 - fVar176 * (float)local_288._0_4_;
        fVar106 = fVar228 * fVar106 - fVar178 * (float)local_288._4_4_;
        fVar150 = fVar239 * fVar150 - fVar188 * (float)uStack_280;
        fVar152 = fVar240 * fVar152 - fVar189 * uStack_280._4_4_;
      }
      fVar228 = auVar218._0_4_ * auVar218._0_4_;
      fVar240 = auVar218._4_4_ * auVar218._4_4_;
      fVar257 = auVar218._8_4_ * auVar218._8_4_;
      fVar286 = auVar218._12_4_ * auVar218._12_4_;
      fVar227 = (fVar200 + fVar46) - fVar228;
      fVar239 = (fVar213 + fVar78) - fVar240;
      fVar255 = (fVar214 + fVar190) - fVar257;
      fVar256 = (fVar215 + fVar245) - fVar286;
      fVar176 = (fVar46 - fVar200) + fVar228;
      fVar178 = (fVar78 - fVar213) + fVar240;
      fVar188 = (fVar190 - fVar214) + fVar257;
      fVar189 = (fVar245 - fVar215) + fVar286;
      fVar46 = (fVar192 + fVar192) * 0.0;
      fVar78 = (fVar154 + fVar154) * 0.0;
      fVar190 = (fVar149 + fVar149) * 0.0;
      fVar245 = (fVar151 + fVar151) * 0.0;
      fVar287 = (fVar82 + fVar82) * 0.0;
      fVar292 = (fVar103 + fVar103) * 0.0;
      fVar293 = (fVar104 + fVar104) * 0.0;
      fVar294 = (fVar105 + fVar105) * 0.0;
      fVar296 = fVar287 + fVar46 + (fVar171 - fVar228);
      fVar308 = fVar292 + fVar78 + (fVar172 - fVar240);
      fVar310 = fVar293 + fVar190 + (fVar173 - fVar257);
      fVar312 = fVar294 + fVar245 + (fVar175 - fVar286);
      fVar200 = (fVar171 - fVar228) * 0.0;
      fVar213 = (fVar172 - fVar240) * 0.0;
      fVar214 = (fVar173 - fVar257) * 0.0;
      fVar215 = (fVar175 - fVar286) * 0.0;
      fVar82 = fVar46 + fVar82 + fVar82 + fVar200;
      fVar46 = fVar78 + fVar103 + fVar103 + fVar213;
      fVar190 = fVar190 + fVar104 + fVar104 + fVar214;
      fVar171 = fVar245 + fVar105 + fVar105 + fVar215;
      fVar200 = fVar200 + fVar192 + fVar192 + fVar287;
      fVar213 = fVar213 + fVar154 + fVar154 + fVar292;
      fVar214 = fVar214 + fVar149 + fVar149 + fVar293;
      fVar215 = fVar215 + fVar151 + fVar151 + fVar294;
      fVar245 = (fVar191 + fVar191) * 0.0;
      fVar192 = (fVar197 + fVar197) * 0.0;
      fVar154 = (fVar198 + fVar198) * 0.0;
      fVar149 = (fVar199 + fVar199) * 0.0;
      fVar103 = fVar227 * 0.0;
      fVar104 = fVar239 * 0.0;
      fVar105 = fVar255 * 0.0;
      fVar78 = fVar256 * 0.0;
      fVar173 = fVar245 + fVar103 + fVar241 + fVar241;
      fVar287 = fVar192 + fVar104 + fVar242 + fVar242;
      fVar292 = fVar154 + fVar105 + fVar243 + fVar243;
      fVar293 = fVar149 + fVar78 + fVar244 + fVar244;
      fVar314 = (fVar241 + fVar241) * 0.0;
      fVar322 = (fVar242 + fVar242) * 0.0;
      fVar325 = (fVar243 + fVar243) * 0.0;
      fVar328 = (fVar244 + fVar244) * 0.0;
      fVar228 = fVar227 + fVar245 + fVar314;
      fVar240 = fVar239 + fVar192 + fVar322;
      fVar242 = fVar255 + fVar154 + fVar325;
      fVar286 = fVar256 + fVar149 + fVar328;
      fVar314 = fVar314 + fVar103 + fVar191 + fVar191;
      fVar322 = fVar322 + fVar104 + fVar197 + fVar197;
      fVar325 = fVar325 + fVar105 + fVar198 + fVar198;
      fVar328 = fVar328 + fVar78 + fVar199 + fVar199;
      fVar245 = fVar176 * 0.0;
      fVar192 = fVar178 * 0.0;
      fVar154 = fVar188 * 0.0;
      fVar149 = fVar189 * 0.0;
      fVar103 = (fVar107 + fVar107) * 0.0;
      fVar104 = (fVar106 + fVar106) * 0.0;
      fVar105 = (fVar150 + fVar150) * 0.0;
      fVar78 = (fVar152 + fVar152) * 0.0;
      fVar315 = fVar103 + fVar245 + fVar153 + fVar153;
      fVar323 = fVar104 + fVar192 + fVar155 + fVar155;
      fVar326 = fVar105 + fVar154 + fVar156 + fVar156;
      fVar329 = fVar78 + fVar149 + fVar170 + fVar170;
      fVar172 = (fVar153 + fVar153) * 0.0;
      fVar175 = (fVar155 + fVar155) * 0.0;
      fVar191 = (fVar156 + fVar156) * 0.0;
      fVar170 = (fVar170 + fVar170) * 0.0;
      fVar294 = fVar245 + fVar107 + fVar107 + fVar172;
      fVar295 = fVar192 + fVar106 + fVar106 + fVar175;
      fVar307 = fVar154 + fVar150 + fVar150 + fVar191;
      fVar309 = fVar149 + fVar152 + fVar152 + fVar170;
      fVar172 = fVar172 + fVar103 + fVar176;
      fVar175 = fVar175 + fVar104 + fVar178;
      fVar191 = fVar191 + fVar105 + fVar188;
      fVar170 = fVar170 + fVar78 + fVar189;
      fVar244 = (float)local_218._0_4_ * fVar296 + fVar173 * 0.0 + fVar315 * 0.0;
      fVar255 = (float)local_218._4_4_ * fVar308 + fVar287 * 0.0 + fVar323 * 0.0;
      fVar256 = (float)uStack_210 * fVar310 + fVar292 * 0.0 + fVar326 * 0.0;
      fVar257 = uStack_210._4_4_ * fVar312 + fVar293 * 0.0 + fVar329 * 0.0;
      fVar311 = (float)local_218._0_4_ * fVar82 + fVar228 * 0.0 + fVar294 * 0.0;
      fVar268 = (float)local_218._4_4_ * fVar46 + fVar240 * 0.0 + fVar295 * 0.0;
      fVar269 = (float)uStack_210 * fVar190 + fVar242 * 0.0 + fVar307 * 0.0;
      fVar270 = uStack_210._4_4_ * fVar171 + fVar286 * 0.0 + fVar309 * 0.0;
      fVar227 = (float)local_218._0_4_ * fVar200 + fVar314 * 0.0 + fVar172 * 0.0;
      fVar239 = (float)local_218._4_4_ * fVar213 + fVar322 * 0.0 + fVar175 * 0.0;
      fVar241 = (float)uStack_210 * fVar214 + fVar325 * 0.0 + fVar191 * 0.0;
      fVar243 = uStack_210._4_4_ * fVar215 + fVar328 * 0.0 + fVar170 * 0.0;
      fVar103 = (float)local_258._0_4_ * fVar296 + (float)local_1d8._0_4_ * fVar173 + fVar315 * 0.0;
      fVar105 = (float)local_258._4_4_ * fVar308 + (float)local_1d8._4_4_ * fVar287 + fVar323 * 0.0;
      fVar245 = fStack_250 * fVar310 + fStack_1d0 * fVar292 + fVar326 * 0.0;
      fVar107 = fStack_24c * fVar312 + fStack_1cc * fVar293 + fVar329 * 0.0;
      fVar106 = (float)local_258._0_4_ * fVar82 + (float)local_1d8._0_4_ * fVar228 + fVar294 * 0.0;
      fVar149 = (float)local_258._4_4_ * fVar46 + (float)local_1d8._4_4_ * fVar240 + fVar295 * 0.0;
      fVar150 = fStack_250 * fVar190 + fStack_1d0 * fVar242 + fVar307 * 0.0;
      fVar151 = fStack_24c * fVar171 + fStack_1cc * fVar286 + fVar309 * 0.0;
      fVar152 = (float)local_258._0_4_ * fVar200 + (float)local_1d8._0_4_ * fVar314 + fVar172 * 0.0;
      fVar153 = (float)local_258._4_4_ * fVar213 + (float)local_1d8._4_4_ * fVar322 + fVar175 * 0.0;
      fVar155 = fStack_250 * fVar214 + fStack_1d0 * fVar325 + fVar191 * 0.0;
      fVar156 = fStack_24c * fVar215 + fStack_1cc * fVar328 + fVar170 * 0.0;
      fVar189 = (float)local_248._0_4_ * fVar296 +
                (float)local_1a8._0_4_ * fVar173 + (float)local_1b8._0_4_ * fVar315;
      fVar197 = (float)local_248._4_4_ * fVar308 +
                (float)local_1a8._4_4_ * fVar287 + (float)local_1b8._4_4_ * fVar323;
      fVar198 = fStack_240 * fVar310 + fStack_1a0 * fVar292 + fStack_1b0 * fVar326;
      fVar199 = fStack_23c * fVar312 + fStack_19c * fVar293 + fStack_1ac * fVar329;
      fVar313 = (float)local_248._0_4_ * fVar82 +
                (float)local_1a8._0_4_ * fVar228 + (float)local_1b8._0_4_ * fVar294;
      fVar321 = (float)local_248._4_4_ * fVar46 +
                (float)local_1a8._4_4_ * fVar240 + (float)local_1b8._4_4_ * fVar295;
      fVar324 = fStack_240 * fVar190 + fStack_1a0 * fVar242 + fStack_1b0 * fVar307;
      fVar327 = fStack_23c * fVar171 + fStack_19c * fVar286 + fStack_1ac * fVar309;
      fVar104 = (float)local_248._0_4_ * fVar200 +
                (float)local_1a8._0_4_ * fVar314 + (float)local_1b8._0_4_ * fVar172;
      fVar78 = (float)local_248._4_4_ * fVar213 +
               (float)local_1a8._4_4_ * fVar322 + (float)local_1b8._4_4_ * fVar175;
      fVar192 = fStack_240 * fVar214 + fStack_1a0 * fVar325 + fStack_1b0 * fVar191;
      fVar154 = fStack_23c * fVar215 + fStack_19c * fVar328 + fStack_1ac * fVar170;
      fVar173 = fVar296 * (float)local_188._0_4_ +
                fVar173 * (float)local_198._0_4_ + fVar315 * (float)local_268._0_4_ +
                (float)local_278._0_4_ + 0.0;
      fVar176 = fVar308 * (float)local_188._4_4_ +
                fVar287 * (float)local_198._4_4_ + fVar323 * (float)local_268._4_4_ +
                (float)local_278._4_4_ + 0.0;
      fVar178 = fVar310 * fStack_180 + fVar292 * fStack_190 + fVar326 * (float)uStack_260 +
                (float)uStack_270 + 0.0;
      fVar188 = fVar312 * fStack_17c + fVar293 * fStack_18c + fVar329 * uStack_260._4_4_ +
                uStack_270._4_4_ + 0.0;
      fVar228 = fVar82 * (float)local_188._0_4_ +
                fVar228 * (float)local_198._0_4_ + fVar294 * (float)local_268._0_4_ +
                (float)local_238._0_4_ + 0.0;
      fVar240 = fVar46 * (float)local_188._4_4_ +
                fVar240 * (float)local_198._4_4_ + fVar295 * (float)local_268._4_4_ +
                (float)local_238._4_4_ + 0.0;
      fVar242 = fVar190 * fStack_180 + fVar242 * fStack_190 + fVar307 * (float)uStack_260 +
                (float)uStack_230 + 0.0;
      fVar171 = fVar171 * fStack_17c + fVar286 * fStack_18c + fVar309 * uStack_260._4_4_ +
                uStack_230._4_4_ + 0.0;
      fVar172 = fVar200 * (float)local_188._0_4_ +
                fVar314 * (float)local_198._0_4_ + fVar172 * (float)local_268._0_4_ +
                (float)local_228._0_4_ + 0.0;
      fVar175 = fVar213 * (float)local_188._4_4_ +
                fVar322 * (float)local_198._4_4_ + fVar175 * (float)local_268._4_4_ +
                (float)local_228._4_4_ + 0.0;
      fVar191 = fVar214 * fStack_180 + fVar325 * fStack_190 + fVar191 * (float)uStack_260 +
                (float)uStack_220 + 0.0;
      fVar200 = fVar215 * fStack_17c + fVar328 * fStack_18c + fVar170 * uStack_260._4_4_ +
                uStack_220._4_4_ + 0.0;
      auVar165._0_4_ = fVar106 * fVar104 - fVar152 * fVar313;
      auVar165._4_4_ = fVar149 * fVar78 - fVar153 * fVar321;
      auVar165._8_4_ = fVar150 * fVar192 - fVar155 * fVar324;
      auVar165._12_4_ = fVar151 * fVar154 - fVar156 * fVar327;
      auVar224._0_4_ = fVar152 * fVar189 - fVar103 * fVar104;
      auVar224._4_4_ = fVar153 * fVar197 - fVar105 * fVar78;
      auVar224._8_4_ = fVar155 * fVar198 - fVar245 * fVar192;
      auVar224._12_4_ = fVar156 * fVar199 - fVar107 * fVar154;
      fVar82 = fVar103 * fVar313 - fVar106 * fVar189;
      fVar46 = fVar105 * fVar321 - fVar149 * fVar197;
      auVar282._4_4_ = fVar46;
      auVar282._0_4_ = fVar82;
      fVar190 = fVar245 * fVar324 - fVar150 * fVar198;
      fVar170 = fVar107 * fVar327 - fVar151 * fVar199;
      auVar235._0_4_ = fVar313 * fVar227 - fVar104 * fVar311;
      auVar235._4_4_ = fVar321 * fVar239 - fVar78 * fVar268;
      auVar235._8_4_ = fVar324 * fVar241 - fVar192 * fVar269;
      auVar235._12_4_ = fVar327 * fVar243 - fVar154 * fVar270;
      auVar29._0_4_ = fVar104 * fVar244 - fVar189 * fVar227;
      auVar29._4_4_ = fVar78 * fVar255 - fVar197 * fVar239;
      auVar29._8_4_ = fVar192 * fVar256 - fVar198 * fVar241;
      auVar29._12_4_ = fVar154 * fVar257 - fVar199 * fVar243;
      auVar184._0_4_ = fVar189 * fVar311 - fVar313 * fVar244;
      auVar184._4_4_ = fVar197 * fVar268 - fVar321 * fVar255;
      auVar184._8_4_ = fVar198 * fVar269 - fVar324 * fVar256;
      auVar184._12_4_ = fVar199 * fVar270 - fVar327 * fVar257;
      auVar304._0_4_ = fVar311 * fVar152 - fVar227 * fVar106;
      auVar304._4_4_ = fVar268 * fVar153 - fVar239 * fVar149;
      auVar304._8_4_ = fVar269 * fVar155 - fVar241 * fVar150;
      auVar304._12_4_ = fVar270 * fVar156 - fVar243 * fVar151;
      auVar319._0_4_ = fVar227 * fVar103 - fVar152 * fVar244;
      auVar319._4_4_ = fVar239 * fVar105 - fVar153 * fVar255;
      auVar319._8_4_ = fVar241 * fVar245 - fVar155 * fVar256;
      auVar319._12_4_ = fVar243 * fVar107 - fVar156 * fVar257;
      auVar290._4_4_ = fVar149 * fVar255 - fVar105 * fVar268;
      auVar290._0_4_ = fVar106 * fVar244 - fVar103 * fVar311;
      auVar282._8_4_ = fVar190;
      auVar282._12_4_ = fVar170;
      auVar290._8_4_ = fVar150 * fVar256 - fVar245 * fVar269;
      auVar290._12_4_ = fVar151 * fVar257 - fVar107 * fVar270;
      auVar210._0_4_ = fVar244 * auVar165._0_4_ + fVar311 * auVar224._0_4_ + fVar227 * fVar82;
      auVar210._4_4_ = fVar255 * auVar165._4_4_ + fVar268 * auVar224._4_4_ + fVar239 * fVar46;
      auVar210._8_4_ = fVar256 * auVar165._8_4_ + fVar269 * auVar224._8_4_ + fVar241 * fVar190;
      auVar210._12_4_ = fVar257 * auVar165._12_4_ + fVar270 * auVar224._12_4_ + fVar243 * fVar170;
      auVar159 = divps(auVar165,auVar210);
      auVar262 = divps(auVar235,auVar210);
      auVar298 = divps(auVar304,auVar210);
      auVar218 = divps(auVar224,auVar210);
      _local_248 = divps(auVar29,auVar210);
      auVar317 = divps(auVar319,auVar210);
      auVar276 = divps(auVar282,auVar210);
      _local_258 = divps(auVar184,auVar210);
      auVar272 = divps(auVar290,auVar210);
      fVar82 = fVar173 * auVar159._0_4_ + fVar228 * auVar218._0_4_ + fVar172 * auVar276._0_4_;
      fVar103 = fVar176 * auVar159._4_4_ + fVar240 * auVar218._4_4_ + fVar175 * auVar276._4_4_;
      fVar104 = fVar178 * auVar159._8_4_ + fVar242 * auVar218._8_4_ + fVar191 * auVar276._8_4_;
      fVar105 = fVar188 * auVar159._12_4_ + fVar171 * auVar218._12_4_ + fVar200 * auVar276._12_4_;
      fVar46 = fVar173 * auVar262._0_4_ + fVar228 * local_248._0_4_ + fVar172 * local_258._0_4_;
      fVar78 = fVar176 * auVar262._4_4_ + fVar240 * local_248._4_4_ + fVar175 * local_258._4_4_;
      fVar190 = fVar178 * auVar262._8_4_ + fVar242 * local_248._8_4_ + fVar191 * local_258._8_4_;
      fVar245 = fVar188 * auVar262._12_4_ + fVar171 * local_248._12_4_ + fVar200 * local_258._12_4_;
      fVar192 = fVar173 * auVar298._0_4_ + fVar228 * auVar317._0_4_ + fVar172 * auVar272._0_4_;
      fVar107 = fVar176 * auVar298._4_4_ + fVar240 * auVar317._4_4_ + fVar175 * auVar272._4_4_;
      fVar154 = fVar178 * auVar298._8_4_ + fVar242 * auVar317._8_4_ + fVar191 * auVar272._8_4_;
      fVar106 = fVar188 * auVar298._12_4_ + fVar171 * auVar317._12_4_ + fVar200 * auVar272._12_4_;
    }
    else {
      fVar82 = pGVar4->fnumTimeSegments;
      fVar103 = (pGVar4->time_range).lower;
      auVar83._0_4_ = (pGVar4->time_range).upper - fVar103;
      auVar49._4_4_ = fVar103;
      auVar49._0_4_ = fVar103;
      auVar49._8_4_ = fVar103;
      auVar49._12_4_ = fVar103;
      auVar110._4_4_ = fVar82;
      auVar110._0_4_ = fVar82;
      auVar110._8_4_ = fVar82;
      auVar110._12_4_ = fVar82;
      auVar271._0_4_ = *(float *)(ray + 0x70) - fVar103;
      auVar271._4_4_ = *(float *)(ray + 0x74) - fVar103;
      auVar271._8_4_ = *(float *)(ray + 0x78) - fVar103;
      auVar271._12_4_ = *(float *)(ray + 0x7c) - fVar103;
      auVar83._4_4_ = auVar83._0_4_;
      auVar83._8_4_ = auVar83._0_4_;
      auVar83._12_4_ = auVar83._0_4_;
      auVar272 = divps(auVar271,auVar83);
      auVar273._0_4_ = auVar272._0_4_ * fVar82;
      auVar273._4_4_ = auVar272._4_4_ * fVar82;
      auVar273._8_4_ = auVar272._8_4_ * fVar82;
      auVar273._12_4_ = auVar272._12_4_ * fVar82;
      auVar272 = roundps(auVar49,auVar273,1);
      auVar16._0_4_ = fVar82 + -1.0;
      auVar16._4_4_ = auVar16._0_4_;
      auVar16._8_4_ = auVar16._0_4_;
      auVar16._12_4_ = auVar16._0_4_;
      auVar272 = minps(auVar272,auVar16);
      auVar272 = maxps(auVar272,ZEXT816(0));
      auVar274._0_4_ = auVar273._0_4_ - auVar272._0_4_;
      auVar274._4_4_ = auVar273._4_4_ - auVar272._4_4_;
      auVar274._8_4_ = auVar273._8_4_ - auVar272._8_4_;
      auVar274._12_4_ = auVar273._12_4_ - auVar272._12_4_;
      auVar229._0_4_ = (float)(int)auVar272._0_4_;
      auVar229._4_4_ = (int)auVar272._4_4_;
      auVar229._8_4_ = (int)auVar272._8_4_;
      iStack_4c = (int)auVar272._12_4_;
      local_58 = auVar229;
      lVar6 = 0;
      if ((uVar10 & 0xff) != 0) {
        for (; ((uVar10 & 0xff) >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      iVar38 = *(int *)(local_58 + lVar6 * 4);
      auVar17._0_4_ = -(uint)((float)iVar38 == auVar229._0_4_);
      auVar17._4_4_ = -(uint)(iVar38 == auVar229._4_4_);
      auVar17._8_4_ = -(uint)(iVar38 == auVar229._8_4_);
      auVar17._12_4_ = -(uint)(iVar38 == iStack_4c);
      iVar13 = movmskps(uVar39,~auVar17 & local_38);
      if (iVar13 == 0) {
        plVar11 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments + (long)iVar38 * 0x38);
        iVar38 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 + (long)iVar38 * 0x38);
        if (iVar38 == 0x9134) {
          lVar6 = *plVar11;
          lVar12 = plVar11[2] * uVar15;
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x10 + lVar12),0x1c);
          auVar272 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x20 + lVar12),0x28);
          v_9.field_0._0_12_ = auVar272._0_12_;
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 4 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x14 + lVar12),0x1c);
          auVar272 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x24 + lVar12),0x28);
          v_3.field_0._0_12_ = auVar272._0_12_;
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 8 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x18 + lVar12),0x1c);
          auVar272 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x28 + lVar12),0x28);
          auVar246 = auVar272._0_12_;
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                              *(undefined4 *)(lVar6 + 0x1c + lVar12),0x1c);
          auVar272 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x2c + lVar12),0x28);
          v_1.field_0._0_12_ = auVar272._0_12_;
        }
        else if (iVar38 == 0x9234) {
          lVar6 = *plVar11;
          lVar12 = plVar11[2] * uVar15;
          uVar2 = *(undefined8 *)(lVar6 + 4 + lVar12);
          v_9.field_0._4_4_ = (int)uVar2;
          v_9.field_0._0_4_ = *(undefined4 *)(lVar6 + lVar12);
          v_9.field_0._8_4_ = (int)((ulong)uVar2 >> 0x20);
          uVar2 = *(undefined8 *)(lVar6 + 0x10 + lVar12);
          v_3.field_0._4_4_ = (int)uVar2;
          v_3.field_0._0_4_ = *(undefined4 *)(lVar6 + 0xc + lVar12);
          v_3.field_0._8_4_ = (int)((ulong)uVar2 >> 0x20);
          uVar2 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
          auVar246._4_4_ = (int)uVar2;
          auVar246._0_4_ = *(undefined4 *)(lVar6 + 0x18 + lVar12);
          auVar246._8_4_ = (int)((ulong)uVar2 >> 0x20);
          uVar2 = *(undefined8 *)(lVar6 + 0x28 + lVar12);
          v_1.field_0._4_4_ = (int)uVar2;
          v_1.field_0._0_4_ = *(undefined4 *)(lVar6 + 0x24 + lVar12);
          v_1.field_0._8_4_ = (int)((ulong)uVar2 >> 0x20);
        }
        else if (iVar38 == 0xb001) {
          lVar6 = *plVar11;
          lVar12 = plVar11[2] * uVar15;
          auVar248._8_8_ = 0;
          auVar248._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar12);
          auVar159 = insertps(auVar248,*(undefined4 *)(lVar6 + 8 + lVar12),0x20);
          uVar2 = *(undefined8 *)(lVar6 + 0x34 + lVar12);
          auVar157._4_4_ = (int)uVar2;
          auVar157._0_4_ = *(undefined4 *)(lVar6 + lVar12);
          auVar157._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar157._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
          auVar216._4_4_ = (int)uVar2;
          auVar216._0_4_ = *(undefined4 *)(lVar6 + 0x18 + lVar12);
          auVar216._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar216._12_4_ = 0;
          fVar82 = *(float *)(lVar6 + 0x24 + lVar12);
          fVar103 = *(float *)(lVar6 + 0x28 + lVar12);
          fVar104 = *(float *)(lVar6 + 0x2c + lVar12);
          fVar105 = *(float *)(lVar6 + 0x30 + lVar12);
          fVar78 = fVar105 * fVar105 + fVar104 * fVar104 + fVar82 * fVar82 + fVar103 * fVar103;
          auVar272 = rsqrtss(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
          fVar46 = auVar272._0_4_;
          auVar229._0_4_ = fVar78 * -0.5 * fVar46;
          auVar229._4_8_ = 0;
          auVar193._4_12_ = auVar272._4_12_;
          fVar46 = fVar46 * fVar46 * auVar229._0_4_ + fVar46 * 1.5;
          auVar272 = insertps(auVar216,ZEXT416((uint)(fVar82 * fVar46)),0x30);
          v_1.field_0._0_12_ = auVar272._0_12_;
          auVar272 = insertps(auVar157,ZEXT416((uint)(fVar103 * fVar46)),0x30);
          v_9.field_0._0_12_ = auVar272._0_12_;
          auVar193._0_4_ = fVar46 * fVar105;
          auVar276 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                              *(undefined4 *)(lVar6 + 4 + lVar12),0x10);
          auVar272 = insertps(auVar159,auVar193,0x30);
          auVar246 = auVar272._0_12_;
          auVar272 = insertps(auVar276,*(undefined4 *)(lVar6 + 0x3c + lVar12),0x20);
          auVar272 = insertps(auVar272,ZEXT416((uint)(fVar104 * fVar46)),0x30);
          v_3.field_0._0_12_ = auVar272._0_12_;
        }
        else if (iVar38 == 0x9244) {
          lVar6 = *plVar11;
          lVar12 = plVar11[2] * uVar15;
          v_9.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar6 + lVar12),0);
          v_3.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar12),0);
          auVar246 = SUB1612(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar12),0);
          v_1.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar12),0);
        }
        fVar82 = v_9.field_0._0_4_;
        fVar103 = v_9.field_0._4_4_;
        fVar104 = v_9.field_0._8_4_;
        fVar107 = v_3.field_0._0_4_;
        fVar154 = v_3.field_0._4_4_;
        auVar258._8_4_ = v_3.field_0._8_4_;
        auVar258._4_4_ = auVar258._8_4_;
        auVar258._0_4_ = auVar258._8_4_;
        fVar190 = auVar246._0_4_;
        fVar245 = auVar246._4_4_;
        fVar192 = auVar246._8_4_;
        fVar105 = v_1.field_0._0_4_;
        fVar46 = v_1.field_0._4_4_;
        fVar78 = v_1.field_0._8_4_;
        auVar48._4_4_ = fVar46;
        auVar48._0_4_ = fVar46;
        auVar48._8_4_ = fVar46;
        iVar38 = (int)plVar11[0xb];
        if (iVar38 == 0x9134) {
          lVar6 = plVar11[7];
          lVar12 = uVar15 * plVar11[9];
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x10 + lVar12),0x1c);
          auVar272 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x20 + lVar12),0x28);
          auVar48 = auVar272._0_12_;
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 4 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x14 + lVar12),0x1c);
          auVar272 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x24 + lVar12),0x28);
          v_15.field_0._0_12_ = auVar272._0_12_;
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 8 + lVar12)),
                              *(undefined4 *)(lVar6 + 0x18 + lVar12),0x1c);
          auVar272 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x28 + lVar12),0x28);
          auVar229 = auVar272._0_12_;
          auVar272 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                              *(undefined4 *)(lVar6 + 0x1c + lVar12),0x1c);
          auVar272 = insertps(auVar272,*(undefined4 *)(lVar6 + 0x2c + lVar12),0x28);
          auVar259 = auVar272._0_12_;
        }
        else if (iVar38 == 0x9234) {
          lVar6 = plVar11[7];
          lVar12 = uVar15 * plVar11[9];
          uVar2 = *(undefined8 *)(lVar6 + 4 + lVar12);
          auVar48._4_4_ = (int)uVar2;
          auVar48._0_4_ = *(undefined4 *)(lVar6 + lVar12);
          auVar48._8_4_ = (int)((ulong)uVar2 >> 0x20);
          uVar2 = *(undefined8 *)(lVar6 + 0x10 + lVar12);
          v_15.field_0._4_4_ = (int)uVar2;
          v_15.field_0._0_4_ = *(undefined4 *)(lVar6 + 0xc + lVar12);
          v_15.field_0._8_4_ = (int)((ulong)uVar2 >> 0x20);
          uVar2 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
          auVar229._4_4_ = (int)uVar2;
          auVar229._0_4_ = (float)*(undefined4 *)(lVar6 + 0x18 + lVar12);
          auVar229._8_4_ = (int)((ulong)uVar2 >> 0x20);
          uVar2 = *(undefined8 *)(lVar6 + 0x28 + lVar12);
          auVar259._4_4_ = (int)uVar2;
          auVar259._0_4_ = *(undefined4 *)(lVar6 + 0x24 + lVar12);
          auVar259._8_4_ = (int)((ulong)uVar2 >> 0x20);
        }
        else if (iVar38 == 0xb001) {
          lVar6 = plVar11[7];
          lVar12 = uVar15 * plVar11[9];
          auVar230._8_8_ = 0;
          auVar230._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar12);
          auVar159 = insertps(auVar230,*(undefined4 *)(lVar6 + 8 + lVar12),0x20);
          uVar2 = *(undefined8 *)(lVar6 + 0x34 + lVar12);
          auVar50._4_4_ = (int)uVar2;
          auVar50._0_4_ = *(undefined4 *)(lVar6 + lVar12);
          auVar50._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar50._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
          auVar260._4_4_ = (int)uVar2;
          auVar260._0_4_ = *(undefined4 *)(lVar6 + 0x18 + lVar12);
          auVar260._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar260._12_4_ = 0;
          fVar106 = *(float *)(lVar6 + 0x24 + lVar12);
          fVar149 = *(float *)(lVar6 + 0x28 + lVar12);
          fVar150 = *(float *)(lVar6 + 0x2c + lVar12);
          fVar151 = *(float *)(lVar6 + 0x30 + lVar12);
          fVar153 = fVar151 * fVar151 + fVar150 * fVar150 + fVar106 * fVar106 + fVar149 * fVar149;
          auVar272 = rsqrtss(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153));
          fVar152 = auVar272._0_4_;
          auVar84._4_12_ = auVar272._4_12_;
          fVar152 = fVar152 * fVar152 * fVar153 * -0.5 * fVar152 + fVar152 * 1.5;
          auVar272 = insertps(auVar260,ZEXT416((uint)(fVar106 * fVar152)),0x30);
          auVar259 = auVar272._0_12_;
          auVar272 = insertps(auVar50,ZEXT416((uint)(fVar149 * fVar152)),0x30);
          auVar48 = auVar272._0_12_;
          auVar84._0_4_ = fVar152 * fVar151;
          auVar276 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                              *(undefined4 *)(lVar6 + 4 + lVar12),0x10);
          auVar272 = insertps(auVar159,auVar84,0x30);
          auVar229 = auVar272._0_12_;
          auVar272 = insertps(auVar276,*(undefined4 *)(lVar6 + 0x3c + lVar12),0x20);
          auVar272 = insertps(auVar272,ZEXT416((uint)(fVar150 * fVar152)),0x30);
          v_15.field_0._0_12_ = auVar272._0_12_;
        }
        else {
          auVar259 = auVar258;
          if (iVar38 == 0x9244) {
            lVar6 = plVar11[7];
            lVar12 = uVar15 * plVar11[9];
            auVar48 = SUB1612(*(undefined1 (*) [16])(lVar6 + lVar12),0);
            v_15.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar12),0);
            auVar229 = SUB1612(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar12),0);
            auVar259 = SUB1612(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar12),0);
          }
        }
        fVar106 = auVar48._0_4_;
        fVar149 = auVar48._4_4_;
        fVar150 = auVar48._8_4_;
        fVar191 = 1.0 - auVar274._0_4_;
        fVar197 = 1.0 - auVar274._4_4_;
        fVar198 = 1.0 - auVar274._8_4_;
        fVar199 = 1.0 - auVar274._12_4_;
        fVar200 = fVar82 * fVar191 + fVar106 * auVar274._0_4_;
        fVar213 = fVar82 * fVar197 + fVar106 * auVar274._4_4_;
        fVar214 = fVar82 * fVar198 + fVar106 * auVar274._8_4_;
        fVar215 = fVar82 * fVar199 + fVar106 * auVar274._12_4_;
        fVar287 = fVar103 * fVar191 + fVar149 * auVar274._0_4_;
        fVar292 = fVar103 * fVar197 + fVar149 * auVar274._4_4_;
        fVar293 = fVar103 * fVar198 + fVar149 * auVar274._8_4_;
        fVar294 = fVar103 * fVar199 + fVar149 * auVar274._12_4_;
        fVar155 = fVar104 * fVar191 + fVar150 * auVar274._0_4_;
        fVar170 = fVar104 * fVar197 + fVar150 * auVar274._4_4_;
        fVar172 = fVar104 * fVar198 + fVar150 * auVar274._8_4_;
        fVar175 = fVar104 * fVar199 + fVar150 * auVar274._12_4_;
        fVar82 = v_15.field_0._0_4_;
        fVar103 = v_15.field_0._4_4_;
        fVar104 = v_15.field_0._8_4_;
        fVar106 = fVar107 * fVar191 + fVar82 * auVar274._0_4_;
        fVar149 = fVar107 * fVar197 + fVar82 * auVar274._4_4_;
        fVar151 = fVar107 * fVar198 + fVar82 * auVar274._8_4_;
        fVar153 = fVar107 * fVar199 + fVar82 * auVar274._12_4_;
        fVar107 = fVar154 * fVar191 + fVar103 * auVar274._0_4_;
        fVar150 = fVar154 * fVar197 + fVar103 * auVar274._4_4_;
        fVar152 = fVar154 * fVar198 + fVar103 * auVar274._8_4_;
        fVar154 = fVar154 * fVar199 + fVar103 * auVar274._12_4_;
        fVar156 = auVar258._8_4_ * fVar191 + fVar104 * auVar274._0_4_;
        fVar171 = auVar258._8_4_ * fVar197 + fVar104 * auVar274._4_4_;
        fVar173 = auVar258._8_4_ * fVar198 + fVar104 * auVar274._8_4_;
        fVar176 = auVar258._8_4_ * fVar199 + fVar104 * auVar274._12_4_;
        fVar82 = auVar229._0_4_;
        fVar103 = auVar229._4_4_;
        fVar104 = auVar229._8_4_;
        fVar178 = fVar190 * fVar191 + fVar82 * auVar274._0_4_;
        fVar188 = fVar190 * fVar197 + fVar82 * auVar274._4_4_;
        fVar189 = fVar190 * fVar198 + fVar82 * auVar274._8_4_;
        fVar190 = fVar190 * fVar199 + fVar82 * auVar274._12_4_;
        fVar295 = fVar245 * fVar191 + fVar103 * auVar274._0_4_;
        fVar307 = fVar245 * fVar197 + fVar103 * auVar274._4_4_;
        fVar309 = fVar245 * fVar198 + fVar103 * auVar274._8_4_;
        fVar311 = fVar245 * fVar199 + fVar103 * auVar274._12_4_;
        fVar82 = auVar259._0_4_;
        fVar103 = auVar259._4_4_;
        fVar286 = auVar259._8_4_;
        fVar245 = fVar192 * fVar191 + fVar104 * auVar274._0_4_;
        fVar255 = fVar192 * fVar197 + fVar104 * auVar274._4_4_;
        fVar256 = fVar192 * fVar198 + fVar104 * auVar274._8_4_;
        fVar257 = fVar192 * fVar199 + fVar104 * auVar274._12_4_;
        fVar227 = fVar105 * fVar191 + fVar82 * auVar274._0_4_;
        fVar239 = fVar105 * fVar197 + fVar82 * auVar274._4_4_;
        fVar241 = fVar105 * fVar198 + fVar82 * auVar274._8_4_;
        fVar243 = fVar105 * fVar199 + fVar82 * auVar274._12_4_;
        fVar228 = fVar46 * fVar191 + fVar103 * auVar274._0_4_;
        fVar240 = fVar46 * fVar197 + fVar103 * auVar274._4_4_;
        fVar242 = fVar46 * fVar198 + fVar103 * auVar274._8_4_;
        fVar244 = fVar46 * fVar199 + fVar103 * auVar274._12_4_;
        fVar192 = fVar191 * fVar78 + fVar286 * auVar274._0_4_;
        fVar191 = fVar197 * fVar78 + fVar286 * auVar274._4_4_;
        fVar197 = fVar198 * fVar78 + fVar286 * auVar274._8_4_;
        fVar198 = fVar199 * fVar78 + fVar286 * auVar274._12_4_;
        fVar82 = fVar107 * fVar245 - fVar156 * fVar295;
        fVar103 = fVar150 * fVar255 - fVar171 * fVar307;
        auVar158._4_4_ = fVar103;
        auVar158._0_4_ = fVar82;
        fVar104 = fVar152 * fVar256 - fVar173 * fVar309;
        fVar105 = fVar154 * fVar257 - fVar176 * fVar311;
        auVar217._0_4_ = fVar156 * fVar178 - fVar106 * fVar245;
        auVar217._4_4_ = fVar171 * fVar188 - fVar149 * fVar255;
        auVar217._8_4_ = fVar173 * fVar189 - fVar151 * fVar256;
        auVar217._12_4_ = fVar176 * fVar190 - fVar153 * fVar257;
        auVar275._0_4_ = fVar106 * fVar295 - fVar107 * fVar178;
        auVar275._4_4_ = fVar149 * fVar307 - fVar150 * fVar188;
        auVar275._8_4_ = fVar151 * fVar309 - fVar152 * fVar189;
        auVar275._12_4_ = fVar153 * fVar311 - fVar154 * fVar190;
        auVar261._0_4_ = fVar155 * fVar295 - fVar287 * fVar245;
        auVar261._4_4_ = fVar170 * fVar307 - fVar292 * fVar255;
        auVar261._8_4_ = fVar172 * fVar309 - fVar293 * fVar256;
        auVar261._12_4_ = fVar175 * fVar311 - fVar294 * fVar257;
        auVar249._0_4_ = fVar245 * fVar200 - fVar155 * fVar178;
        auVar249._4_4_ = fVar255 * fVar213 - fVar170 * fVar188;
        auVar249._8_4_ = fVar256 * fVar214 - fVar172 * fVar189;
        auVar249._12_4_ = fVar257 * fVar215 - fVar175 * fVar190;
        auVar179._0_4_ = fVar178 * fVar287 - fVar295 * fVar200;
        auVar179._4_4_ = fVar188 * fVar292 - fVar307 * fVar213;
        auVar179._8_4_ = fVar189 * fVar293 - fVar309 * fVar214;
        auVar179._12_4_ = fVar190 * fVar294 - fVar311 * fVar215;
        auVar297._0_4_ = fVar287 * fVar156 - fVar155 * fVar107;
        auVar297._4_4_ = fVar292 * fVar171 - fVar170 * fVar150;
        auVar297._8_4_ = fVar293 * fVar173 - fVar172 * fVar152;
        auVar297._12_4_ = fVar294 * fVar176 - fVar175 * fVar154;
        auVar316._0_4_ = fVar155 * fVar106 - fVar156 * fVar200;
        auVar316._4_4_ = fVar170 * fVar149 - fVar171 * fVar213;
        auVar316._8_4_ = fVar172 * fVar151 - fVar173 * fVar214;
        auVar316._12_4_ = fVar175 * fVar153 - fVar176 * fVar215;
        auVar108._0_4_ = fVar107 * fVar200 - fVar106 * fVar287;
        auVar108._4_4_ = fVar150 * fVar213 - fVar149 * fVar292;
        auVar108._8_4_ = fVar152 * fVar214 - fVar151 * fVar293;
        auVar108._12_4_ = fVar154 * fVar215 - fVar153 * fVar294;
        auVar201._0_4_ = fVar200 * fVar82 + fVar287 * auVar217._0_4_ + fVar155 * auVar275._0_4_;
        auVar201._4_4_ = fVar213 * fVar103 + fVar292 * auVar217._4_4_ + fVar170 * auVar275._4_4_;
        auVar201._8_4_ = fVar214 * fVar104 + fVar293 * auVar217._8_4_ + fVar172 * auVar275._8_4_;
        auVar201._12_4_ = fVar215 * fVar105 + fVar294 * auVar217._12_4_ + fVar175 * auVar275._12_4_;
        auVar158._8_4_ = fVar104;
        auVar158._12_4_ = fVar105;
        auVar159 = divps(auVar158,auVar201);
        auVar262 = divps(auVar261,auVar201);
        auVar298 = divps(auVar297,auVar201);
        auVar218 = divps(auVar217,auVar201);
        _local_248 = divps(auVar249,auVar201);
        auVar317 = divps(auVar316,auVar201);
        auVar276 = divps(auVar275,auVar201);
        _local_258 = divps(auVar179,auVar201);
        auVar272 = divps(auVar108,auVar201);
        fVar82 = fVar227 * auVar159._0_4_ + fVar228 * auVar218._0_4_ + fVar192 * auVar276._0_4_;
        fVar103 = fVar239 * auVar159._4_4_ + fVar240 * auVar218._4_4_ + fVar191 * auVar276._4_4_;
        fVar104 = fVar241 * auVar159._8_4_ + fVar242 * auVar218._8_4_ + fVar197 * auVar276._8_4_;
        fVar105 = fVar243 * auVar159._12_4_ + fVar244 * auVar218._12_4_ + fVar198 * auVar276._12_4_;
        fVar46 = fVar227 * auVar262._0_4_ + fVar228 * local_248._0_4_ + fVar192 * local_258._0_4_;
        fVar78 = fVar239 * auVar262._4_4_ + fVar240 * local_248._4_4_ + fVar191 * local_258._4_4_;
        fVar190 = fVar241 * auVar262._8_4_ + fVar242 * local_248._8_4_ + fVar197 * local_258._8_4_;
        fVar245 = fVar243 * auVar262._12_4_ +
                  fVar244 * local_248._12_4_ + fVar198 * local_258._12_4_;
        fVar192 = fVar227 * auVar298._0_4_ + fVar228 * auVar317._0_4_ + fVar192 * auVar272._0_4_;
        fVar107 = fVar239 * auVar298._4_4_ + fVar240 * auVar317._4_4_ + fVar191 * auVar272._4_4_;
        fVar154 = fVar241 * auVar298._8_4_ + fVar242 * auVar317._8_4_ + fVar197 * auVar272._8_4_;
        fVar106 = fVar243 * auVar298._12_4_ + fVar244 * auVar317._12_4_ + fVar198 * auVar272._12_4_;
      }
      else {
        auVar251 = local_38;
        auVar278 = auVar274;
        auVar272 = local_38;
        do {
          lVar6 = 0;
          if ((uVar10 & 0xf) != 0) {
            for (; ((uVar10 & 0xf) >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          iVar38 = *(int *)(local_58 + (long)(int)lVar6 * 4);
          auVar20._0_4_ = -(uint)((float)iVar38 == auVar229._0_4_);
          auVar20._4_4_ = -(uint)(iVar38 == auVar229._4_4_);
          auVar20._8_4_ = -(uint)(iVar38 == auVar229._8_4_);
          auVar20._12_4_ = -(uint)(iVar38 == iStack_4c);
          auVar20 = auVar20 & auVar272;
          plVar11 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments + (long)iVar38 * 0x38);
          iVar38 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 + (long)iVar38 * 0x38);
          if (iVar38 == 0x9134) {
            lVar6 = *plVar11;
            lVar12 = plVar11[2] * uVar15;
            auVar159 = insertps(ZEXT416(*(uint *)(lVar6 + lVar12)),
                                *(undefined4 *)(lVar6 + 0x10 + lVar12),0x1c);
            auVar278 = insertps(auVar159,*(undefined4 *)(lVar6 + 0x20 + lVar12),0x28);
            auVar159 = insertps(ZEXT416(*(uint *)(lVar6 + 4 + lVar12)),
                                *(undefined4 *)(lVar6 + 0x14 + lVar12),0x1c);
            in_XMM13 = insertps(auVar159,*(undefined4 *)(lVar6 + 0x24 + lVar12),0x28);
            auVar159 = insertps(ZEXT416(*(uint *)(lVar6 + 8 + lVar12)),
                                *(undefined4 *)(lVar6 + 0x18 + lVar12),0x1c);
            _local_258 = insertps(auVar159,*(undefined4 *)(lVar6 + 0x28 + lVar12),0x28);
            auVar159 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                                *(undefined4 *)(lVar6 + 0x1c + lVar12),0x1c);
            in_XMM7 = insertps(auVar159,*(undefined4 *)(lVar6 + 0x2c + lVar12),0x28);
          }
          else if (iVar38 == 0x9234) {
            lVar6 = *plVar11;
            lVar12 = plVar11[2] * uVar15;
            uVar2 = *(undefined8 *)(lVar6 + 4 + lVar12);
            auVar278._4_4_ = (int)uVar2;
            auVar278._0_4_ = *(undefined4 *)(lVar6 + lVar12);
            auVar278._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar278._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x10 + lVar12);
            in_XMM13._4_4_ = (int)uVar2;
            in_XMM13._0_4_ = *(undefined4 *)(lVar6 + 0xc + lVar12);
            in_XMM13._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM13._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
            local_258._4_4_ = (int)uVar2;
            local_258._0_4_ = *(undefined4 *)(lVar6 + 0x18 + lVar12);
            fStack_250 = (float)(int)((ulong)uVar2 >> 0x20);
            fStack_24c = 0.0;
            uVar2 = *(undefined8 *)(lVar6 + 0x28 + lVar12);
            in_XMM7._4_4_ = (int)uVar2;
            in_XMM7._0_4_ = *(undefined4 *)(lVar6 + 0x24 + lVar12);
            in_XMM7._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM7._12_4_ = 0;
          }
          else if (iVar38 == 0xb001) {
            lVar6 = *plVar11;
            lVar12 = plVar11[2] * uVar15;
            auVar299._8_8_ = 0;
            auVar299._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar12);
            auVar276 = insertps(auVar299,*(undefined4 *)(lVar6 + 8 + lVar12),0x20);
            uVar2 = *(undefined8 *)(lVar6 + 0x34 + lVar12);
            auVar277._4_4_ = (int)uVar2;
            auVar277._0_4_ = *(undefined4 *)(lVar6 + lVar12);
            auVar277._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar277._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x1c + lVar12);
            auVar202._4_4_ = (int)uVar2;
            auVar202._0_4_ = *(undefined4 *)(lVar6 + 0x18 + lVar12);
            auVar202._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar202._12_4_ = 0;
            fVar82 = *(float *)(lVar6 + 0x24 + lVar12);
            fVar103 = *(float *)(lVar6 + 0x28 + lVar12);
            fVar104 = *(float *)(lVar6 + 0x2c + lVar12);
            fVar105 = *(float *)(lVar6 + 0x30 + lVar12);
            fVar78 = fVar105 * fVar105 + fVar104 * fVar104 + fVar82 * fVar82 + fVar103 * fVar103;
            auVar159 = rsqrtss(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
            fVar46 = auVar159._0_4_;
            fVar46 = fVar46 * fVar46 * fVar78 * -0.5 * fVar46 + fVar46 * 1.5;
            in_XMM7 = insertps(auVar202,ZEXT416((uint)(fVar82 * fVar46)),0x30);
            auVar278 = insertps(auVar277,ZEXT416((uint)(fVar103 * fVar46)),0x30);
            auVar109._0_4_ = fVar46 * fVar105;
            auVar109._4_12_ = auVar159._4_12_;
            auVar159 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + lVar12)),
                                *(undefined4 *)(lVar6 + 4 + lVar12),0x10);
            _local_258 = insertps(auVar276,auVar109,0x30);
            auVar159 = insertps(auVar159,*(undefined4 *)(lVar6 + 0x3c + lVar12),0x20);
            in_XMM13 = insertps(auVar159,ZEXT416((uint)(fVar104 * fVar46)),0x30);
          }
          else if (iVar38 == 0x9244) {
            lVar6 = *plVar11;
            lVar12 = plVar11[2] * uVar15;
            auVar278 = *(undefined1 (*) [16])(lVar6 + lVar12);
            in_XMM13 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar12);
            _local_258 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar12);
            in_XMM7 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar12);
          }
          uVar47 = auVar278._0_4_;
          uVar79 = auVar278._4_4_;
          uVar80 = auVar278._8_4_;
          auVar51._4_4_ = uVar47;
          auVar51._0_4_ = uVar47;
          auVar51._8_4_ = uVar47;
          auVar51._12_4_ = uVar47;
          _local_288 = blendvps(_local_288,auVar51,auVar20);
          auVar52._4_4_ = uVar79;
          auVar52._0_4_ = uVar79;
          auVar52._8_4_ = uVar79;
          auVar52._12_4_ = uVar79;
          _local_268 = blendvps(_local_268,auVar52,auVar20);
          auVar53._4_4_ = uVar80;
          auVar53._0_4_ = uVar80;
          auVar53._8_4_ = uVar80;
          auVar53._12_4_ = uVar80;
          _local_188 = blendvps(_local_188,auVar53,auVar20);
          uVar47 = in_XMM13._0_4_;
          uVar79 = in_XMM13._4_4_;
          uVar80 = in_XMM13._8_4_;
          auVar54._4_4_ = uVar47;
          auVar54._0_4_ = uVar47;
          auVar54._8_4_ = uVar47;
          auVar54._12_4_ = uVar47;
          _local_238 = blendvps(_local_238,auVar54,auVar20);
          auVar55._4_4_ = uVar79;
          auVar55._0_4_ = uVar79;
          auVar55._8_4_ = uVar79;
          auVar55._12_4_ = uVar79;
          _local_218 = blendvps(_local_218,auVar55,auVar20);
          auVar56._4_4_ = uVar80;
          auVar56._0_4_ = uVar80;
          auVar56._8_4_ = uVar80;
          auVar56._12_4_ = uVar80;
          _local_198 = blendvps(_local_198,auVar56,auVar20);
          uVar47 = local_258._0_4_;
          uVar79 = local_258._4_4_;
          auVar300._8_4_ = local_258._8_4_;
          auVar57._4_4_ = uVar47;
          auVar57._0_4_ = uVar47;
          auVar57._8_4_ = uVar47;
          auVar57._12_4_ = uVar47;
          in_XMM5 = blendvps(in_XMM5,auVar57,auVar20);
          auVar58._4_4_ = uVar79;
          auVar58._0_4_ = uVar79;
          auVar58._8_4_ = uVar79;
          auVar58._12_4_ = uVar79;
          _local_1a8 = blendvps(_local_1a8,auVar58,auVar20);
          auVar300._4_4_ = auVar300._8_4_;
          auVar300._0_4_ = auVar300._8_4_;
          auVar300._12_4_ = auVar300._8_4_;
          in_XMM4 = blendvps(in_XMM4,auVar300,auVar20);
          uVar47 = in_XMM7._0_4_;
          uVar79 = in_XMM7._4_4_;
          uVar80 = in_XMM7._8_4_;
          auVar59._4_4_ = uVar47;
          auVar59._0_4_ = uVar47;
          auVar59._8_4_ = uVar47;
          auVar59._12_4_ = uVar47;
          auVar110 = blendvps(auVar110,auVar59,auVar20);
          auVar60._4_4_ = uVar79;
          auVar60._0_4_ = uVar79;
          auVar60._8_4_ = uVar79;
          auVar60._12_4_ = uVar79;
          in_XMM6 = blendvps(in_XMM6,auVar60,auVar20);
          auVar61._4_4_ = uVar80;
          auVar61._0_4_ = uVar80;
          auVar61._8_4_ = uVar80;
          auVar61._12_4_ = uVar80;
          _local_1b8 = blendvps(_local_1b8,auVar61,auVar20);
          auVar272 = auVar272 ^ auVar20;
          iVar38 = (int)plVar11[0xb];
          if (iVar38 == 0x9134) {
            lVar6 = plVar11[7];
            plVar11 = (long *)(plVar11[9] * uVar15);
            auVar159 = insertps(ZEXT416(*(uint *)(lVar6 + (long)plVar11)),
                                *(undefined4 *)(lVar6 + 0x10 + (long)plVar11),0x1c);
            auVar251 = insertps(auVar159,*(undefined4 *)(lVar6 + 0x20 + (long)plVar11),0x28);
            auVar159 = insertps(ZEXT416(*(uint *)(lVar6 + 4 + (long)plVar11)),
                                *(undefined4 *)(lVar6 + 0x14 + (long)plVar11),0x1c);
            in_XMM15 = insertps(auVar159,*(undefined4 *)(lVar6 + 0x24 + (long)plVar11),0x28);
            auVar159 = insertps(ZEXT416(*(uint *)(lVar6 + 8 + (long)plVar11)),
                                *(undefined4 *)(lVar6 + 0x18 + (long)plVar11),0x1c);
            _local_248 = insertps(auVar159,*(undefined4 *)(lVar6 + 0x28 + (long)plVar11),0x28);
            auVar159 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + (long)plVar11)),
                                *(undefined4 *)(lVar6 + 0x1c + (long)plVar11),0x1c);
            in_XMM11 = insertps(auVar159,*(undefined4 *)(lVar6 + 0x2c + (long)plVar11),0x28);
          }
          else if (iVar38 == 0x9234) {
            lVar6 = plVar11[7];
            plVar11 = (long *)(plVar11[9] * uVar15);
            uVar2 = *(undefined8 *)(lVar6 + 4 + (long)plVar11);
            auVar251._4_4_ = (int)uVar2;
            auVar251._0_4_ = *(undefined4 *)(lVar6 + (long)plVar11);
            auVar251._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar251._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x10 + (long)plVar11);
            in_XMM15._4_4_ = (int)uVar2;
            in_XMM15._0_4_ = *(undefined4 *)(lVar6 + 0xc + (long)plVar11);
            in_XMM15._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM15._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x1c + (long)plVar11);
            local_248._4_4_ = (int)uVar2;
            local_248._0_4_ = *(undefined4 *)(lVar6 + 0x18 + (long)plVar11);
            fStack_240 = (float)(int)((ulong)uVar2 >> 0x20);
            fStack_23c = 0.0;
            uVar2 = *(undefined8 *)(lVar6 + 0x28 + (long)plVar11);
            in_XMM11._4_4_ = (int)uVar2;
            in_XMM11._0_4_ = *(undefined4 *)(lVar6 + 0x24 + (long)plVar11);
            in_XMM11._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM11._12_4_ = 0;
          }
          else if (iVar38 == 0xb001) {
            lVar6 = plVar11[7];
            plVar11 = (long *)(plVar11[9] * uVar15);
            auVar111._8_8_ = 0;
            auVar111._0_8_ = *(ulong *)(lVar6 + 0x10 + (long)plVar11);
            auVar159 = insertps(auVar111,*(undefined4 *)(lVar6 + 8 + (long)plVar11),0x20);
            uVar2 = *(undefined8 *)(lVar6 + 0x34 + (long)plVar11);
            auVar250._4_4_ = (int)uVar2;
            auVar250._0_4_ = *(undefined4 *)(lVar6 + (long)plVar11);
            auVar250._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar250._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar6 + 0x1c + (long)plVar11);
            auVar263._4_4_ = (int)uVar2;
            auVar263._0_4_ = *(undefined4 *)(lVar6 + 0x18 + (long)plVar11);
            auVar263._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar263._12_4_ = 0;
            fVar82 = *(float *)(lVar6 + 0x24 + (long)plVar11);
            fVar103 = *(float *)(lVar6 + 0x28 + (long)plVar11);
            fVar104 = *(float *)(lVar6 + 0x2c + (long)plVar11);
            fVar105 = *(float *)(lVar6 + 0x30 + (long)plVar11);
            fVar78 = fVar105 * fVar105 + fVar104 * fVar104 + fVar82 * fVar82 + fVar103 * fVar103;
            auVar276 = rsqrtss(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78));
            fVar46 = auVar276._0_4_;
            fVar46 = fVar46 * fVar46 * fVar78 * -0.5 * fVar46 + fVar46 * 1.5;
            in_XMM11 = insertps(auVar263,ZEXT416((uint)(fVar82 * fVar46)),0x30);
            auVar251 = insertps(auVar250,ZEXT416((uint)(fVar103 * fVar46)),0x30);
            auVar160._0_4_ = fVar46 * fVar105;
            auVar160._4_12_ = auVar276._4_12_;
            auVar276 = insertps(ZEXT416(*(uint *)(lVar6 + 0xc + (long)plVar11)),
                                *(undefined4 *)(lVar6 + 4 + (long)plVar11),0x10);
            _local_248 = insertps(auVar159,auVar160,0x30);
            auVar159 = insertps(auVar276,*(undefined4 *)(lVar6 + 0x3c + (long)plVar11),0x20);
            in_XMM15 = insertps(auVar159,ZEXT416((uint)(fVar104 * fVar46)),0x30);
          }
          else if (iVar38 == 0x9244) {
            lVar6 = plVar11[7];
            plVar11 = (long *)(plVar11[9] * uVar15);
            auVar251 = *(undefined1 (*) [16])(lVar6 + (long)plVar11);
            in_XMM15 = *(undefined1 (*) [16])(lVar6 + 0x10 + (long)plVar11);
            _local_248 = *(undefined1 (*) [16])(lVar6 + 0x20 + (long)plVar11);
            in_XMM11 = *(undefined1 (*) [16])(lVar6 + 0x30 + (long)plVar11);
          }
          uVar47 = auVar251._0_4_;
          uVar79 = auVar251._4_4_;
          uVar80 = auVar251._8_4_;
          auVar62._4_4_ = uVar47;
          auVar62._0_4_ = uVar47;
          auVar62._8_4_ = uVar47;
          auVar62._12_4_ = uVar47;
          _local_138 = blendvps(_local_138,auVar62,auVar20);
          auVar63._4_4_ = uVar79;
          auVar63._0_4_ = uVar79;
          auVar63._8_4_ = uVar79;
          auVar63._12_4_ = uVar79;
          _local_128 = blendvps(_local_128,auVar63,auVar20);
          auVar64._4_4_ = uVar80;
          auVar64._0_4_ = uVar80;
          auVar64._8_4_ = uVar80;
          auVar64._12_4_ = uVar80;
          _local_118 = blendvps(_local_118,auVar64,auVar20);
          uVar47 = in_XMM15._0_4_;
          uVar79 = in_XMM15._4_4_;
          uVar80 = in_XMM15._8_4_;
          auVar65._4_4_ = uVar47;
          auVar65._0_4_ = uVar47;
          auVar65._8_4_ = uVar47;
          auVar65._12_4_ = uVar47;
          _local_108 = blendvps(_local_108,auVar65,auVar20);
          auVar66._4_4_ = uVar79;
          auVar66._0_4_ = uVar79;
          auVar66._8_4_ = uVar79;
          auVar66._12_4_ = uVar79;
          _local_148 = blendvps(_local_148,auVar66,auVar20);
          auVar67._4_4_ = uVar80;
          auVar67._0_4_ = uVar80;
          auVar67._8_4_ = uVar80;
          auVar67._12_4_ = uVar80;
          _local_178 = blendvps(_local_178,auVar67,auVar20);
          uVar47 = local_248._0_4_;
          uVar79 = local_248._4_4_;
          auVar112._8_4_ = local_248._8_4_;
          auVar68._4_4_ = uVar47;
          auVar68._0_4_ = uVar47;
          auVar68._8_4_ = uVar47;
          auVar68._12_4_ = uVar47;
          _local_c8 = blendvps(_local_c8,auVar68,auVar20);
          auVar69._4_4_ = uVar79;
          auVar69._0_4_ = uVar79;
          auVar69._8_4_ = uVar79;
          auVar69._12_4_ = uVar79;
          _local_1c8 = blendvps(_local_1c8,auVar69,auVar20);
          auVar112._4_4_ = auVar112._8_4_;
          auVar112._0_4_ = auVar112._8_4_;
          auVar112._12_4_ = auVar112._8_4_;
          _local_1e8 = blendvps(_local_1e8,auVar112,auVar20);
          uVar47 = in_XMM11._0_4_;
          uVar79 = in_XMM11._4_4_;
          uVar80 = in_XMM11._8_4_;
          auVar70._4_4_ = uVar47;
          auVar70._0_4_ = uVar47;
          auVar70._8_4_ = uVar47;
          auVar70._12_4_ = uVar47;
          _local_208 = blendvps(_local_208,auVar70,auVar20);
          auVar71._4_4_ = uVar79;
          auVar71._0_4_ = uVar79;
          auVar71._8_4_ = uVar79;
          auVar71._12_4_ = uVar79;
          _local_1f8 = blendvps(_local_1f8,auVar71,auVar20);
          auVar72._4_4_ = uVar80;
          auVar72._0_4_ = uVar80;
          auVar72._8_4_ = uVar80;
          auVar72._12_4_ = uVar80;
          _local_1d8 = blendvps(_local_1d8,auVar72,auVar20);
          uVar10 = movmskps((int)plVar11,auVar272);
        } while (uVar10 != 0);
        fVar82 = 1.0 - auVar274._0_4_;
        fVar103 = 1.0 - auVar274._4_4_;
        fVar104 = 1.0 - auVar274._8_4_;
        fVar105 = 1.0 - auVar274._12_4_;
        fVar200 = (float)local_288._0_4_ * fVar82 + (float)local_138._0_4_ * auVar274._0_4_;
        fVar213 = (float)local_288._4_4_ * fVar103 + (float)local_138._4_4_ * auVar274._4_4_;
        fVar214 = (float)uStack_280 * fVar104 + fStack_130 * auVar274._8_4_;
        fVar215 = uStack_280._4_4_ * fVar105 + fStack_12c * auVar274._12_4_;
        fVar241 = (float)local_268._0_4_ * fVar82 + (float)local_128._0_4_ * auVar274._0_4_;
        fVar242 = (float)local_268._4_4_ * fVar103 + (float)local_128._4_4_ * auVar274._4_4_;
        fVar243 = (float)uStack_260 * fVar104 + fStack_120 * auVar274._8_4_;
        fVar244 = uStack_260._4_4_ * fVar105 + fStack_11c * auVar274._12_4_;
        fVar176 = (float)local_188._0_4_ * fVar82 + (float)local_118._0_4_ * auVar274._0_4_;
        fVar188 = (float)local_188._4_4_ * fVar103 + (float)local_118._4_4_ * auVar274._4_4_;
        fVar191 = fStack_180 * fVar104 + fStack_110 * auVar274._8_4_;
        fVar198 = fStack_17c * fVar105 + fStack_10c * auVar274._12_4_;
        fVar178 = (float)local_238._0_4_ * fVar82 + (float)local_108._0_4_ * auVar274._0_4_;
        fVar189 = (float)local_238._4_4_ * fVar103 + (float)local_108._4_4_ * auVar274._4_4_;
        fVar197 = (float)uStack_230 * fVar104 + fStack_100 * auVar274._8_4_;
        fVar199 = uStack_230._4_4_ * fVar105 + fStack_fc * auVar274._12_4_;
        fVar287 = (float)local_218._0_4_ * fVar82 + (float)local_148._0_4_ * auVar274._0_4_;
        fVar292 = (float)local_218._4_4_ * fVar103 + (float)local_148._4_4_ * auVar274._4_4_;
        fVar293 = (float)uStack_210 * fVar104 + fStack_140 * auVar274._8_4_;
        fVar294 = uStack_210._4_4_ * fVar105 + fStack_13c * auVar274._12_4_;
        fVar227 = (float)local_198._0_4_ * fVar82 + (float)local_178._0_4_ * auVar274._0_4_;
        fVar228 = (float)local_198._4_4_ * fVar103 + (float)local_178._4_4_ * auVar274._4_4_;
        fVar239 = fStack_190 * fVar104 + fStack_170 * auVar274._8_4_;
        fVar240 = fStack_18c * fVar105 + fStack_16c * auVar274._12_4_;
        fVar153 = in_XMM5._0_4_ * fVar82 + (float)local_c8._0_4_ * auVar274._0_4_;
        fVar155 = in_XMM5._4_4_ * fVar103 + (float)local_c8._4_4_ * auVar274._4_4_;
        fVar156 = in_XMM5._8_4_ * fVar104 + fStack_c0 * auVar274._8_4_;
        fVar170 = in_XMM5._12_4_ * fVar105 + fStack_bc * auVar274._12_4_;
        fVar46 = (float)local_1a8._0_4_ * fVar82 + (float)local_1c8._0_4_ * auVar274._0_4_;
        fVar78 = (float)local_1a8._4_4_ * fVar103 + (float)local_1c8._4_4_ * auVar274._4_4_;
        fVar190 = fStack_1a0 * fVar104 + fStack_1c0 * auVar274._8_4_;
        fVar245 = fStack_19c * fVar105 + fStack_1bc * auVar274._12_4_;
        fVar255 = in_XMM4._0_4_ * fVar82 + (float)local_1e8._0_4_ * auVar274._0_4_;
        fVar256 = in_XMM4._4_4_ * fVar103 + (float)local_1e8._4_4_ * auVar274._4_4_;
        fVar257 = in_XMM4._8_4_ * fVar104 + fStack_1e0 * auVar274._8_4_;
        fVar286 = in_XMM4._12_4_ * fVar105 + fStack_1dc * auVar274._12_4_;
        fVar149 = auVar110._0_4_ * fVar82 + (float)local_208._0_4_ * auVar274._0_4_;
        fVar150 = auVar110._4_4_ * fVar103 + (float)local_208._4_4_ * auVar274._4_4_;
        fVar151 = auVar110._8_4_ * fVar104 + fStack_200 * auVar274._8_4_;
        fVar152 = auVar110._12_4_ * fVar105 + fStack_1fc * auVar274._12_4_;
        fVar171 = in_XMM6._0_4_ * fVar82 + (float)local_1f8._0_4_ * auVar274._0_4_;
        fVar172 = in_XMM6._4_4_ * fVar103 + (float)local_1f8._4_4_ * auVar274._4_4_;
        fVar173 = in_XMM6._8_4_ * fVar104 + fStack_1f0 * auVar274._8_4_;
        fVar175 = in_XMM6._12_4_ * fVar105 + fStack_1ec * auVar274._12_4_;
        fVar192 = fVar82 * (float)local_1b8._0_4_ + (float)local_1d8._0_4_ * auVar274._0_4_;
        fVar107 = fVar103 * (float)local_1b8._4_4_ + (float)local_1d8._4_4_ * auVar274._4_4_;
        fVar154 = fVar104 * fStack_1b0 + fStack_1d0 * auVar274._8_4_;
        fVar106 = fVar105 * fStack_1ac + fStack_1cc * auVar274._12_4_;
        fVar82 = fVar287 * fVar255 - fVar227 * fVar46;
        fVar103 = fVar292 * fVar256 - fVar228 * fVar78;
        auVar161._4_4_ = fVar103;
        auVar161._0_4_ = fVar82;
        fVar104 = fVar293 * fVar257 - fVar239 * fVar190;
        fVar105 = fVar294 * fVar286 - fVar240 * fVar245;
        auVar219._0_4_ = fVar227 * fVar153 - fVar178 * fVar255;
        auVar219._4_4_ = fVar228 * fVar155 - fVar189 * fVar256;
        auVar219._8_4_ = fVar239 * fVar156 - fVar197 * fVar257;
        auVar219._12_4_ = fVar240 * fVar170 - fVar199 * fVar286;
        local_278._0_4_ = fVar178 * fVar46 - fVar287 * fVar153;
        local_278._4_4_ = fVar189 * fVar78 - fVar292 * fVar155;
        uStack_270._0_4_ = fVar197 * fVar190 - fVar293 * fVar156;
        uStack_270._4_4_ = fVar199 * fVar245 - fVar294 * fVar170;
        auVar231._0_4_ = fVar176 * fVar46 - fVar241 * fVar255;
        auVar231._4_4_ = fVar188 * fVar78 - fVar242 * fVar256;
        auVar231._8_4_ = fVar191 * fVar190 - fVar243 * fVar257;
        auVar231._12_4_ = fVar198 * fVar245 - fVar244 * fVar286;
        auVar203._0_4_ = fVar255 * fVar200 - fVar176 * fVar153;
        auVar203._4_4_ = fVar256 * fVar213 - fVar188 * fVar155;
        auVar203._8_4_ = fVar257 * fVar214 - fVar191 * fVar156;
        auVar203._12_4_ = fVar286 * fVar215 - fVar198 * fVar170;
        auVar279._0_4_ = fVar153 * fVar241 - fVar46 * fVar200;
        auVar279._4_4_ = fVar155 * fVar242 - fVar78 * fVar213;
        auVar279._8_4_ = fVar156 * fVar243 - fVar190 * fVar214;
        auVar279._12_4_ = fVar170 * fVar244 - fVar245 * fVar215;
        auVar301._0_4_ = fVar241 * fVar227 - fVar176 * fVar287;
        auVar301._4_4_ = fVar242 * fVar228 - fVar188 * fVar292;
        auVar301._8_4_ = fVar243 * fVar239 - fVar191 * fVar293;
        auVar301._12_4_ = fVar244 * fVar240 - fVar198 * fVar294;
        auVar318._0_4_ = fVar176 * fVar178 - fVar227 * fVar200;
        auVar318._4_4_ = fVar188 * fVar189 - fVar228 * fVar213;
        auVar318._8_4_ = fVar191 * fVar197 - fVar239 * fVar214;
        auVar318._12_4_ = fVar198 * fVar199 - fVar240 * fVar215;
        auVar288._0_4_ = fVar287 * fVar200 - fVar178 * fVar241;
        auVar288._4_4_ = fVar292 * fVar213 - fVar189 * fVar242;
        auVar288._8_4_ = fVar293 * fVar214 - fVar197 * fVar243;
        auVar288._12_4_ = fVar294 * fVar215 - fVar199 * fVar244;
        auVar85._0_4_ =
             fVar200 * fVar82 + fVar241 * auVar219._0_4_ + fVar176 * (float)local_278._0_4_;
        auVar85._4_4_ =
             fVar213 * fVar103 + fVar242 * auVar219._4_4_ + fVar188 * (float)local_278._4_4_;
        auVar85._8_4_ = fVar214 * fVar104 + fVar243 * auVar219._8_4_ + fVar191 * (float)uStack_270;
        auVar85._12_4_ = fVar215 * fVar105 + fVar244 * auVar219._12_4_ + fVar198 * uStack_270._4_4_;
        auVar161._8_4_ = fVar104;
        auVar161._12_4_ = fVar105;
        auVar159 = divps(auVar161,auVar85);
        auVar262 = divps(auVar231,auVar85);
        auVar298 = divps(auVar301,auVar85);
        auVar218 = divps(auVar219,auVar85);
        _local_248 = divps(auVar203,auVar85);
        auVar317 = divps(auVar318,auVar85);
        auVar276 = divps(_local_278,auVar85);
        _local_258 = divps(auVar279,auVar85);
        auVar272 = divps(auVar288,auVar85);
        fVar82 = fVar149 * auVar159._0_4_ + fVar171 * auVar218._0_4_ + fVar192 * auVar276._0_4_;
        fVar103 = fVar150 * auVar159._4_4_ + fVar172 * auVar218._4_4_ + fVar107 * auVar276._4_4_;
        fVar104 = fVar151 * auVar159._8_4_ + fVar173 * auVar218._8_4_ + fVar154 * auVar276._8_4_;
        fVar105 = fVar152 * auVar159._12_4_ + fVar175 * auVar218._12_4_ + fVar106 * auVar276._12_4_;
        fVar46 = fVar149 * auVar262._0_4_ + fVar171 * local_248._0_4_ + fVar192 * local_258._0_4_;
        fVar78 = fVar150 * auVar262._4_4_ + fVar172 * local_248._4_4_ + fVar107 * local_258._4_4_;
        fVar190 = fVar151 * auVar262._8_4_ + fVar173 * local_248._8_4_ + fVar154 * local_258._8_4_;
        fVar245 = fVar152 * auVar262._12_4_ +
                  fVar175 * local_248._12_4_ + fVar106 * local_258._12_4_;
        fVar192 = fVar149 * auVar298._0_4_ + fVar171 * auVar317._0_4_ + fVar192 * auVar272._0_4_;
        fVar107 = fVar150 * auVar298._4_4_ + fVar172 * auVar317._4_4_ + fVar107 * auVar272._4_4_;
        fVar154 = fVar151 * auVar298._8_4_ + fVar173 * auVar317._8_4_ + fVar154 * auVar272._8_4_;
        fVar106 = fVar152 * auVar298._12_4_ + fVar175 * auVar317._12_4_ + fVar106 * auVar272._12_4_;
      }
    }
    pRVar1 = ray + 0x10;
    fVar149 = *(float *)pRVar1;
    fVar150 = *(float *)(ray + 0x14);
    fVar151 = *(float *)(ray + 0x18);
    auVar246 = *(undefined1 (*) [12])pRVar1;
    fVar152 = *(float *)(ray + 0x1c);
    auVar19 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x20;
    fVar153 = *(float *)pRVar1;
    fVar155 = *(float *)(ray + 0x24);
    fVar156 = *(float *)(ray + 0x28);
    auVar229 = *(undefined1 (*) [12])pRVar1;
    fVar170 = *(float *)(ray + 0x2c);
    auVar18 = *(undefined1 (*) [16])pRVar1;
    fVar171 = *(float *)ray;
    fVar172 = *(float *)(ray + 4);
    fVar173 = *(float *)(ray + 8);
    auVar48 = *(undefined1 (*) [12])ray;
    fVar175 = *(float *)(ray + 0xc);
    auVar167 = *(undefined1 (*) [16])ray;
    pRVar1 = ray + 0x40;
    fVar176 = *(float *)pRVar1;
    fVar178 = *(float *)(ray + 0x44);
    fVar188 = *(float *)(ray + 0x48);
    auVar7 = *(undefined1 (*) [12])pRVar1;
    fVar189 = *(float *)(ray + 0x4c);
    auVar236 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x50;
    fVar191 = *(float *)pRVar1;
    fVar197 = *(float *)(ray + 0x54);
    fVar198 = *(float *)(ray + 0x58);
    auVar259 = *(undefined1 (*) [12])pRVar1;
    fVar199 = *(float *)(ray + 0x5c);
    auVar195 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x60;
    fVar200 = *(float *)pRVar1;
    fVar213 = *(float *)(ray + 100);
    fVar214 = *(float *)(ray + 0x68);
    auVar258 = *(undefined1 (*) [12])pRVar1;
    fVar215 = *(float *)(ray + 0x6c);
    auVar30 = *(undefined1 (*) [16])pRVar1;
    *(float *)ray =
         auVar159._0_4_ * fVar171 + auVar218._0_4_ * fVar149 + auVar276._0_4_ * fVar153 + -fVar82;
    *(float *)(ray + 4) =
         auVar159._4_4_ * fVar172 + auVar218._4_4_ * fVar150 + auVar276._4_4_ * fVar155 + -fVar103;
    *(float *)(ray + 8) =
         auVar159._8_4_ * fVar173 + auVar218._8_4_ * fVar151 + auVar276._8_4_ * fVar156 + -fVar104;
    *(float *)(ray + 0xc) =
         auVar159._12_4_ * fVar175 +
         auVar218._12_4_ * fVar152 + auVar276._12_4_ * fVar170 + -fVar105;
    *(float *)(ray + 0x10) =
         auVar262._0_4_ * fVar171 +
         (float)local_248._0_4_ * fVar149 + (float)local_258._0_4_ * fVar153 + -fVar46;
    *(float *)(ray + 0x14) =
         auVar262._4_4_ * fVar172 +
         (float)local_248._4_4_ * fVar150 + (float)local_258._4_4_ * fVar155 + -fVar78;
    *(float *)(ray + 0x18) =
         auVar262._8_4_ * fVar173 + fStack_240 * fVar151 + fStack_250 * fVar156 + -fVar190;
    *(float *)(ray + 0x1c) =
         auVar262._12_4_ * fVar175 + fStack_23c * fVar152 + fStack_24c * fVar170 + -fVar245;
    *(float *)(ray + 0x20) =
         auVar298._0_4_ * fVar171 + auVar317._0_4_ * fVar149 + auVar272._0_4_ * fVar153 + -fVar192;
    *(float *)(ray + 0x24) =
         auVar298._4_4_ * fVar172 + auVar317._4_4_ * fVar150 + auVar272._4_4_ * fVar155 + -fVar107;
    *(float *)(ray + 0x28) =
         auVar298._8_4_ * fVar173 + auVar317._8_4_ * fVar151 + auVar272._8_4_ * fVar156 + -fVar154;
    *(float *)(ray + 0x2c) =
         auVar298._12_4_ * fVar175 +
         auVar317._12_4_ * fVar152 + auVar272._12_4_ * fVar170 + -fVar106;
    *(float *)(ray + 0x40) =
         auVar159._0_4_ * fVar176 + auVar218._0_4_ * fVar191 + auVar276._0_4_ * fVar200;
    *(float *)(ray + 0x44) =
         auVar159._4_4_ * fVar178 + auVar218._4_4_ * fVar197 + auVar276._4_4_ * fVar213;
    *(float *)(ray + 0x48) =
         auVar159._8_4_ * fVar188 + auVar218._8_4_ * fVar198 + auVar276._8_4_ * fVar214;
    *(float *)(ray + 0x4c) =
         auVar159._12_4_ * fVar189 + auVar218._12_4_ * fVar199 + auVar276._12_4_ * fVar215;
    *(float *)(ray + 0x50) =
         auVar262._0_4_ * fVar176 +
         (float)local_248._0_4_ * fVar191 + (float)local_258._0_4_ * fVar200;
    *(float *)(ray + 0x54) =
         auVar262._4_4_ * fVar178 +
         (float)local_248._4_4_ * fVar197 + (float)local_258._4_4_ * fVar213;
    *(float *)(ray + 0x58) = auVar262._8_4_ * fVar188 + fStack_240 * fVar198 + fStack_250 * fVar214;
    *(float *)(ray + 0x5c) = auVar262._12_4_ * fVar189 + fStack_23c * fVar199 + fStack_24c * fVar215
    ;
    *(float *)(ray + 0x60) =
         auVar298._0_4_ * fVar176 + auVar317._0_4_ * fVar191 + auVar272._0_4_ * fVar200;
    *(float *)(ray + 100) =
         auVar298._4_4_ * fVar178 + auVar317._4_4_ * fVar197 + auVar272._4_4_ * fVar213;
    *(float *)(ray + 0x68) =
         auVar298._8_4_ * fVar188 + auVar317._8_4_ * fVar198 + auVar272._8_4_ * fVar214;
    *(float *)(ray + 0x6c) =
         auVar298._12_4_ * fVar189 + auVar317._12_4_ * fVar199 + auVar272._12_4_ * fVar215;
    local_48 = context->args;
    local_28 = local_38._0_8_;
    uStack_20 = local_38._8_8_;
    stack0xffffffffffffffb0 = pRVar5;
    local_58._0_8_ = p_Var9;
    local_38 = auVar247;
    (**(code **)(p_Var9 + 0x98))(&local_28,p_Var9 + 0x58,ray);
    local_228 = auVar48._0_8_;
    uStack_220 = auVar167._8_8_;
    *(undefined1 (*) [8])ray = local_228;
    *(undefined8 *)(ray + 8) = uStack_220;
    local_218 = auVar246._0_8_;
    uStack_210 = auVar19._8_8_;
    *(undefined1 (*) [8])(ray + 0x10) = local_218;
    *(undefined8 *)(ray + 0x18) = uStack_210;
    local_278 = auVar229._0_8_;
    uStack_270 = auVar18._8_8_;
    *(undefined1 (*) [8])(ray + 0x20) = local_278;
    *(undefined8 *)(ray + 0x28) = uStack_270;
    local_268 = auVar7._0_8_;
    uStack_260 = auVar236._8_8_;
    *(undefined1 (*) [8])(ray + 0x40) = local_268;
    *(undefined8 *)(ray + 0x48) = uStack_260;
    local_288 = auVar259._0_8_;
    uStack_280 = auVar195._8_8_;
    *(undefined1 (*) [8])(ray + 0x50) = local_288;
    *(undefined8 *)(ray + 0x58) = uStack_280;
    local_238 = auVar258._0_8_;
    uStack_230 = auVar30._8_8_;
    *(undefined1 (*) [8])(ray + 0x60) = local_238;
    *(undefined8 *)(ray + 0x68) = uStack_230;
    pRVar5->instID[0] = 0xffffffff;
    pRVar5->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }